

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

PrimInfo * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::CurveGeometryInterface,_embree::BezierCurveT>
::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::CurveGeometryInterface,_embree::BezierCurveT>
          *this,PrimRef *prims,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  uint uVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  BufferView<embree::Vec3fa> *pBVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  size_t sVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar13;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined4 uVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  float fVar32;
  float fVar53;
  float fVar54;
  float fVar55;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  float fVar56;
  float fVar70;
  float fVar71;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar72;
  undefined1 auVar62 [16];
  float fVar57;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  float fVar96;
  float fVar116;
  float fVar117;
  Vec3fa n1;
  undefined1 auVar97 [16];
  float fVar118;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  vfloat4 a0_1;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar136;
  float fVar137;
  float fVar149;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar147;
  float fVar148;
  undefined1 auVar146 [64];
  float fVar150;
  float fVar151;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar161;
  float fVar163;
  undefined1 auVar157 [16];
  float fVar164;
  undefined1 auVar158 [32];
  float fVar160;
  float fVar162;
  undefined1 auVar159 [64];
  vfloat4 a0_3;
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  float fVar173;
  float fVar178;
  float fVar180;
  float fVar181;
  float fVar183;
  __m128 a;
  float fVar184;
  undefined1 auVar175 [16];
  float fVar174;
  float fVar179;
  float fVar182;
  float fVar185;
  float fVar186;
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  float fVar187;
  float fVar188;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  undefined1 auVar189 [32];
  float fVar196;
  float fVar197;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  vfloat4 a0;
  undefined1 auVar207 [16];
  float fVar214;
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar215;
  float fVar218;
  float fVar219;
  Vec3fa n0;
  float fVar220;
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  size_t local_240;
  size_t local_220;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar28 = r->_begin;
  if (uVar28 < r->_end) {
    local_218._8_4_ = 0xff800000;
    local_218._0_8_ = 0xff800000ff800000;
    local_218._12_4_ = 0xff800000;
    local_240 = 0;
    auVar146 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
    auVar159 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
    local_1f8._8_4_ = 0x7f800000;
    local_1f8._0_8_ = 0x7f8000007f800000;
    local_1f8._12_4_ = 0x7f800000;
    local_208._8_4_ = 0x7f800000;
    local_208._0_8_ = 0x7f8000007f800000;
    local_208._12_4_ = 0x7f800000;
    local_220 = k;
    local_1e8 = local_218;
    do {
      pBVar5 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
               vertices.items;
      uVar4 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                  super_CurveGeometry.super_Geometry.field_0x58 +
                       *(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                 super_CurveGeometry.field_0x68 * uVar28);
      uVar26 = (ulong)uVar4;
      uVar29 = (ulong)(uVar4 + 3);
      if (uVar29 < (pBVar5->super_RawBufferView).num) {
        uVar30 = (ulong)(uVar4 + 1);
        uVar31 = (ulong)(uVar4 + 2);
        pBVar6 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                 normals.items;
        fVar57 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                 maxRadiusScale;
        lVar27 = 0;
        do {
          lVar7 = *(long *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar27);
          lVar8 = *(long *)((long)&(pBVar5->super_RawBufferView).stride + lVar27);
          auVar63 = vinsertps_avx(ZEXT416(*(uint *)(lVar7 + 0xc + lVar8 * uVar26)),
                                  ZEXT416(*(uint *)(lVar7 + 0xc + lVar8 * uVar30)),0x10);
          auVar63 = vinsertps_avx(auVar63,ZEXT416(*(uint *)(lVar7 + 0xc + lVar8 * uVar31)),0x20);
          auVar63 = vinsertps_avx(auVar63,ZEXT416(*(uint *)(lVar7 + 0xc + lVar8 * uVar29)),0x30);
          auVar58._8_4_ = 0x7fffffff;
          auVar58._0_8_ = 0x7fffffff7fffffff;
          auVar58._12_4_ = 0x7fffffff;
          auVar63 = vandps_avx(auVar63,auVar58);
          auVar58 = auVar146._0_16_;
          auVar63 = vcmpps_avx(auVar63,auVar58,5);
          if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar63[0xf] < '\0') goto LAB_01207589;
          auVar63 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar26);
          auVar152 = auVar159._0_16_;
          auVar12 = vcmpps_avx(auVar63,auVar152,6);
          auVar88 = vcmpps_avx(auVar63,auVar58,1);
          auVar12 = vandps_avx(auVar12,auVar88);
          uVar25 = vmovmskps_avx(auVar12);
          if ((~(byte)uVar25 & 7) != 0) goto LAB_01207589;
          auVar12 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar30);
          auVar88 = vcmpps_avx(auVar12,auVar152,6);
          auVar33 = vcmpps_avx(auVar12,auVar58,1);
          auVar88 = vandps_avx(auVar88,auVar33);
          uVar25 = vmovmskps_avx(auVar88);
          if ((~(byte)uVar25 & 7) != 0) goto LAB_01207589;
          auVar88 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar31);
          auVar33 = vcmpps_avx(auVar88,auVar152,6);
          auVar61 = vcmpps_avx(auVar88,auVar58,1);
          auVar33 = vandps_avx(auVar33,auVar61);
          uVar25 = vmovmskps_avx(auVar33);
          if ((~(byte)uVar25 & 7) != 0) goto LAB_01207589;
          auVar33 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar29);
          auVar61 = vcmpps_avx(auVar33,auVar152,6);
          auVar39 = vcmpps_avx(auVar33,auVar58,1);
          auVar61 = vandps_avx(auVar61,auVar39);
          uVar25 = vmovmskps_avx(auVar61);
          if ((~(byte)uVar25 & 7) != 0) goto LAB_01207589;
          lVar7 = *(long *)((long)&(pBVar6->super_RawBufferView).ptr_ofs + lVar27);
          lVar8 = *(long *)((long)&(pBVar6->super_RawBufferView).stride + lVar27);
          auVar61 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar26);
          auVar39 = vcmpps_avx(auVar61,auVar152,6);
          auVar38 = vcmpps_avx(auVar61,auVar58,1);
          auVar39 = vandps_avx(auVar39,auVar38);
          uVar25 = vmovmskps_avx(auVar39);
          if ((~(byte)uVar25 & 7) != 0) goto LAB_01207589;
          auVar39 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar30);
          auVar152 = vcmpps_avx(auVar39,auVar152,6);
          auVar58 = vcmpps_avx(auVar39,auVar58,1);
          auVar58 = vandps_avx(auVar152,auVar58);
          uVar25 = vmovmskps_avx(auVar58);
          if ((~(byte)uVar25 & 7) != 0) goto LAB_01207589;
          auVar58 = vshufps_avx(auVar63,auVar63,0xff);
          auVar63 = vinsertps_avx(auVar63,ZEXT416((uint)(auVar58._0_4_ * fVar57)),0x30);
          auVar58 = vshufps_avx(auVar12,auVar12,0xff);
          auVar58 = vinsertps_avx(auVar12,ZEXT416((uint)(auVar58._0_4_ * fVar57)),0x30);
          auVar12 = vshufps_avx(auVar88,auVar88,0xff);
          auVar12 = vinsertps_avx(auVar88,ZEXT416((uint)(auVar12._0_4_ * fVar57)),0x30);
          auVar88 = vshufps_avx(auVar33,auVar33,0xff);
          auVar88 = vinsertps_avx(auVar33,ZEXT416((uint)(auVar88._0_4_ * fVar57)),0x30);
          pfVar1 = (float *)(lVar7 + lVar8 * uVar31);
          pfVar2 = (float *)(lVar7 + lVar8 * uVar29);
          fVar56 = *pfVar2;
          fVar70 = pfVar2[1];
          fVar71 = pfVar2[2];
          fVar72 = pfVar2[3];
          fVar180 = auVar88._0_4_;
          fVar183 = auVar88._4_4_;
          fVar186 = auVar88._8_4_;
          fVar136 = auVar88._12_4_;
          fVar150 = auVar12._0_4_ * 0.0;
          fVar160 = auVar12._4_4_ * 0.0;
          fVar162 = auVar12._8_4_ * 0.0;
          fVar164 = auVar12._12_4_ * 0.0;
          fVar137 = fVar150 + fVar180 * 0.0;
          fVar147 = fVar160 + fVar183 * 0.0;
          fVar148 = fVar162 + fVar186 * 0.0;
          fVar149 = fVar164 + fVar136 * 0.0;
          fVar173 = auVar58._0_4_ * 0.0;
          fVar178 = auVar58._4_4_ * 0.0;
          fVar181 = auVar58._8_4_ * 0.0;
          fVar184 = auVar58._12_4_ * 0.0;
          fVar96 = auVar63._0_4_;
          fVar32 = fVar96 + fVar173 + fVar137;
          fVar116 = auVar63._4_4_;
          fVar53 = fVar116 + fVar178 + fVar147;
          fVar117 = auVar63._8_4_;
          fVar54 = fVar117 + fVar181 + fVar148;
          fVar118 = auVar63._12_4_;
          fVar55 = fVar118 + fVar184 + fVar149;
          auVar131._0_4_ = auVar58._0_4_ * 3.0 + fVar137;
          auVar131._4_4_ = auVar58._4_4_ * 3.0 + fVar147;
          auVar131._8_4_ = auVar58._8_4_ * 3.0 + fVar148;
          auVar131._12_4_ = auVar58._12_4_ * 3.0 + fVar149;
          auVar138._0_4_ = fVar96 * 3.0;
          auVar138._4_4_ = fVar116 * 3.0;
          auVar138._8_4_ = fVar117 * 3.0;
          auVar138._12_4_ = fVar118 * 3.0;
          auVar38 = vsubps_avx(auVar131,auVar138);
          fVar187 = *pfVar1 * 0.0;
          fVar190 = pfVar1[1] * 0.0;
          fVar192 = pfVar1[2] * 0.0;
          fVar194 = pfVar1[3] * 0.0;
          fVar137 = fVar187 + fVar56 * 0.0;
          fVar147 = fVar190 + fVar70 * 0.0;
          fVar148 = fVar192 + fVar71 * 0.0;
          fVar149 = fVar194 + fVar72 * 0.0;
          fVar196 = auVar39._0_4_ * 0.0;
          fVar201 = auVar39._4_4_ * 0.0;
          fVar203 = auVar39._8_4_ * 0.0;
          fVar205 = auVar39._12_4_ * 0.0;
          fVar211 = auVar61._0_4_;
          auVar207._0_4_ = fVar211 + fVar196 + fVar137;
          fVar213 = auVar61._4_4_;
          auVar207._4_4_ = fVar213 + fVar201 + fVar147;
          fVar214 = auVar61._8_4_;
          auVar207._8_4_ = fVar214 + fVar203 + fVar148;
          fVar151 = auVar61._12_4_;
          auVar207._12_4_ = fVar151 + fVar205 + fVar149;
          auVar97._0_4_ = auVar39._0_4_ * 3.0 + fVar137;
          auVar97._4_4_ = auVar39._4_4_ * 3.0 + fVar147;
          auVar97._8_4_ = auVar39._8_4_ * 3.0 + fVar148;
          auVar97._12_4_ = auVar39._12_4_ * 3.0 + fVar149;
          auVar132._0_4_ = fVar211 * 3.0;
          auVar132._4_4_ = fVar213 * 3.0;
          auVar132._8_4_ = fVar214 * 3.0;
          auVar132._12_4_ = fVar151 * 3.0;
          auVar88 = vsubps_avx(auVar97,auVar132);
          auVar73._0_4_ = fVar96 * 0.0;
          auVar73._4_4_ = fVar116 * 0.0;
          auVar73._8_4_ = fVar117 * 0.0;
          auVar73._12_4_ = fVar118 * 0.0;
          fVar96 = auVar73._0_4_ + fVar173 + fVar180 + fVar150;
          fVar116 = auVar73._4_4_ + fVar178 + fVar183 + fVar160;
          fVar117 = auVar73._8_4_ + fVar181 + fVar186 + fVar162;
          fVar118 = auVar73._12_4_ + fVar184 + fVar136 + fVar164;
          auVar98._0_4_ = fVar180 * 3.0;
          auVar98._4_4_ = fVar183 * 3.0;
          auVar98._8_4_ = fVar186 * 3.0;
          auVar98._12_4_ = fVar136 * 3.0;
          auVar119._0_4_ = auVar12._0_4_ * 3.0;
          auVar119._4_4_ = auVar12._4_4_ * 3.0;
          auVar119._8_4_ = auVar12._8_4_ * 3.0;
          auVar119._12_4_ = auVar12._12_4_ * 3.0;
          auVar63 = vsubps_avx(auVar98,auVar119);
          auVar99._0_4_ = fVar173 + auVar63._0_4_;
          auVar99._4_4_ = fVar178 + auVar63._4_4_;
          auVar99._8_4_ = fVar181 + auVar63._8_4_;
          auVar99._12_4_ = fVar184 + auVar63._12_4_;
          auVar39 = vsubps_avx(auVar99,auVar73);
          auVar100._0_4_ = fVar211 * 0.0;
          auVar100._4_4_ = fVar213 * 0.0;
          auVar100._8_4_ = fVar214 * 0.0;
          auVar100._12_4_ = fVar151 * 0.0;
          auVar74._0_4_ = auVar100._0_4_ + fVar196 + fVar187 + fVar56;
          auVar74._4_4_ = auVar100._4_4_ + fVar201 + fVar190 + fVar70;
          auVar74._8_4_ = auVar100._8_4_ + fVar203 + fVar192 + fVar71;
          auVar74._12_4_ = auVar100._12_4_ + fVar205 + fVar194 + fVar72;
          auVar59._0_4_ = fVar56 * 3.0;
          auVar59._4_4_ = fVar70 * 3.0;
          auVar59._8_4_ = fVar71 * 3.0;
          auVar59._12_4_ = fVar72 * 3.0;
          auVar33._0_4_ = *pfVar1 * 3.0;
          auVar33._4_4_ = pfVar1[1] * 3.0;
          auVar33._8_4_ = pfVar1[2] * 3.0;
          auVar33._12_4_ = pfVar1[3] * 3.0;
          auVar63 = vsubps_avx(auVar59,auVar33);
          auVar34._0_4_ = fVar196 + auVar63._0_4_;
          auVar34._4_4_ = fVar201 + auVar63._4_4_;
          auVar34._8_4_ = fVar203 + auVar63._8_4_;
          auVar34._12_4_ = fVar205 + auVar63._12_4_;
          auVar33 = vsubps_avx(auVar34,auVar100);
          auVar63 = vshufps_avx(auVar38,auVar38,0xc9);
          auVar58 = vshufps_avx(auVar207,auVar207,0xc9);
          fVar173 = auVar38._0_4_;
          auVar101._0_4_ = fVar173 * auVar58._0_4_;
          fVar181 = auVar38._4_4_;
          auVar101._4_4_ = fVar181 * auVar58._4_4_;
          fVar187 = auVar38._8_4_;
          auVar101._8_4_ = fVar187 * auVar58._8_4_;
          fVar192 = auVar38._12_4_;
          auVar101._12_4_ = fVar192 * auVar58._12_4_;
          auVar120._0_4_ = auVar207._0_4_ * auVar63._0_4_;
          auVar120._4_4_ = auVar207._4_4_ * auVar63._4_4_;
          auVar120._8_4_ = auVar207._8_4_ * auVar63._8_4_;
          auVar120._12_4_ = auVar207._12_4_ * auVar63._12_4_;
          auVar58 = vsubps_avx(auVar120,auVar101);
          auVar12 = vshufps_avx(auVar58,auVar58,0xc9);
          auVar58 = vshufps_avx(auVar88,auVar88,0xc9);
          auVar121._0_4_ = fVar173 * auVar58._0_4_;
          auVar121._4_4_ = fVar181 * auVar58._4_4_;
          auVar121._8_4_ = fVar187 * auVar58._8_4_;
          auVar121._12_4_ = fVar192 * auVar58._12_4_;
          auVar35._0_4_ = auVar88._0_4_ * auVar63._0_4_;
          auVar35._4_4_ = auVar88._4_4_ * auVar63._4_4_;
          auVar35._8_4_ = auVar88._8_4_ * auVar63._8_4_;
          auVar35._12_4_ = auVar88._12_4_ * auVar63._12_4_;
          auVar63 = vsubps_avx(auVar35,auVar121);
          auVar88 = vshufps_avx(auVar63,auVar63,0xc9);
          auVar63 = vshufps_avx(auVar39,auVar39,0xc9);
          auVar58 = vshufps_avx(auVar74,auVar74,0xc9);
          fVar205 = auVar39._0_4_;
          auVar36._0_4_ = fVar205 * auVar58._0_4_;
          fVar213 = auVar39._4_4_;
          auVar36._4_4_ = fVar213 * auVar58._4_4_;
          fVar151 = auVar39._8_4_;
          auVar36._8_4_ = fVar151 * auVar58._8_4_;
          fVar163 = auVar39._12_4_;
          auVar36._12_4_ = fVar163 * auVar58._12_4_;
          auVar75._0_4_ = auVar74._0_4_ * auVar63._0_4_;
          auVar75._4_4_ = auVar74._4_4_ * auVar63._4_4_;
          auVar75._8_4_ = auVar74._8_4_ * auVar63._8_4_;
          auVar75._12_4_ = auVar74._12_4_ * auVar63._12_4_;
          auVar58 = vsubps_avx(auVar75,auVar36);
          auVar152 = vshufps_avx(auVar58,auVar58,0xc9);
          auVar58 = vshufps_avx(auVar33,auVar33,0xc9);
          auVar76._0_4_ = fVar205 * auVar58._0_4_;
          auVar76._4_4_ = fVar213 * auVar58._4_4_;
          auVar76._8_4_ = fVar151 * auVar58._8_4_;
          auVar76._12_4_ = fVar163 * auVar58._12_4_;
          auVar60._0_4_ = auVar33._0_4_ * auVar63._0_4_;
          auVar60._4_4_ = auVar33._4_4_ * auVar63._4_4_;
          auVar60._8_4_ = auVar33._8_4_ * auVar63._8_4_;
          auVar60._12_4_ = auVar33._12_4_ * auVar63._12_4_;
          auVar63 = vsubps_avx(auVar60,auVar76);
          auVar33 = vshufps_avx(auVar63,auVar63,0xc9);
          auVar63 = vdpps_avx(auVar12,auVar12,0x7f);
          fVar137 = auVar63._0_4_;
          auVar175._4_12_ = ZEXT812(0) << 0x20;
          auVar175._0_4_ = fVar137;
          auVar58 = vrsqrtss_avx(auVar175,auVar175);
          fVar56 = auVar58._0_4_;
          auVar58 = vdpps_avx(auVar12,auVar88,0x7f);
          auVar61 = ZEXT416((uint)(fVar56 * 1.5 - fVar137 * 0.5 * fVar56 * fVar56 * fVar56));
          auVar61 = vshufps_avx(auVar61,auVar61,0);
          fVar56 = auVar61._0_4_ * auVar12._0_4_;
          fVar70 = auVar61._4_4_ * auVar12._4_4_;
          fVar71 = auVar61._8_4_ * auVar12._8_4_;
          fVar72 = auVar61._12_4_ * auVar12._12_4_;
          auVar63 = vshufps_avx(auVar63,auVar63,0);
          auVar122._0_4_ = auVar63._0_4_ * auVar88._0_4_;
          auVar122._4_4_ = auVar63._4_4_ * auVar88._4_4_;
          auVar122._8_4_ = auVar63._8_4_ * auVar88._8_4_;
          auVar122._12_4_ = auVar63._12_4_ * auVar88._12_4_;
          auVar63 = vshufps_avx(auVar58,auVar58,0);
          auVar102._0_4_ = auVar63._0_4_ * auVar12._0_4_;
          auVar102._4_4_ = auVar63._4_4_ * auVar12._4_4_;
          auVar102._8_4_ = auVar63._8_4_ * auVar12._8_4_;
          auVar102._12_4_ = auVar63._12_4_ * auVar12._12_4_;
          auVar34 = vsubps_avx(auVar122,auVar102);
          auVar63 = vrcpss_avx(auVar175,auVar175);
          auVar63 = ZEXT416((uint)(auVar63._0_4_ * (2.0 - fVar137 * auVar63._0_4_)));
          auVar12 = vshufps_avx(auVar63,auVar63,0);
          auVar63 = vdpps_avx(auVar152,auVar152,0x7f);
          fVar137 = auVar63._0_4_;
          auVar123._4_12_ = ZEXT812(0) << 0x20;
          auVar123._0_4_ = fVar137;
          auVar58 = vrsqrtss_avx(auVar123,auVar123);
          fVar147 = auVar58._0_4_;
          auVar58 = ZEXT416((uint)(fVar147 * 1.5 - fVar137 * 0.5 * fVar147 * fVar147 * fVar147));
          auVar88 = vshufps_avx(auVar58,auVar58,0);
          fVar147 = auVar88._0_4_ * auVar152._0_4_;
          fVar148 = auVar88._4_4_ * auVar152._4_4_;
          fVar149 = auVar88._8_4_ * auVar152._8_4_;
          fVar150 = auVar88._12_4_ * auVar152._12_4_;
          auVar58 = vdpps_avx(auVar152,auVar33,0x7f);
          auVar63 = vshufps_avx(auVar63,auVar63,0);
          auVar77._0_4_ = auVar63._0_4_ * auVar33._0_4_;
          auVar77._4_4_ = auVar63._4_4_ * auVar33._4_4_;
          auVar77._8_4_ = auVar63._8_4_ * auVar33._8_4_;
          auVar77._12_4_ = auVar63._12_4_ * auVar33._12_4_;
          auVar63 = vshufps_avx(auVar58,auVar58,0);
          auVar37._0_4_ = auVar63._0_4_ * auVar152._0_4_;
          auVar37._4_4_ = auVar63._4_4_ * auVar152._4_4_;
          auVar37._8_4_ = auVar63._8_4_ * auVar152._8_4_;
          auVar37._12_4_ = auVar63._12_4_ * auVar152._12_4_;
          auVar33 = vsubps_avx(auVar77,auVar37);
          auVar63 = vrcpss_avx(auVar123,auVar123);
          auVar63 = ZEXT416((uint)(auVar63._0_4_ * (2.0 - fVar137 * auVar63._0_4_)));
          auVar63 = vshufps_avx(auVar63,auVar63,0);
          auVar152._4_4_ = fVar53;
          auVar152._0_4_ = fVar32;
          auVar152._8_4_ = fVar54;
          auVar152._12_4_ = fVar55;
          auVar58 = vshufps_avx(auVar152,auVar152,0xff);
          auVar133._0_4_ = auVar58._0_4_ * fVar56;
          auVar133._4_4_ = auVar58._4_4_ * fVar70;
          auVar133._8_4_ = auVar58._8_4_ * fVar71;
          auVar133._12_4_ = auVar58._12_4_ * fVar72;
          auVar143 = vsubps_avx(auVar152,auVar133);
          auVar152 = vshufps_avx(auVar38,auVar38,0xff);
          auVar62._0_4_ =
               auVar152._0_4_ * fVar56 +
               auVar58._0_4_ * auVar61._0_4_ * auVar34._0_4_ * auVar12._0_4_;
          auVar62._4_4_ =
               auVar152._4_4_ * fVar70 +
               auVar58._4_4_ * auVar61._4_4_ * auVar34._4_4_ * auVar12._4_4_;
          auVar62._8_4_ =
               auVar152._8_4_ * fVar71 +
               auVar58._8_4_ * auVar61._8_4_ * auVar34._8_4_ * auVar12._8_4_;
          auVar62._12_4_ =
               auVar152._12_4_ * fVar72 +
               auVar58._12_4_ * auVar61._12_4_ * auVar34._12_4_ * auVar12._12_4_;
          auVar152 = vsubps_avx(auVar38,auVar62);
          fVar32 = fVar32 + auVar133._0_4_;
          fVar53 = fVar53 + auVar133._4_4_;
          fVar54 = fVar54 + auVar133._8_4_;
          fVar55 = fVar55 + auVar133._12_4_;
          auVar12._4_4_ = fVar116;
          auVar12._0_4_ = fVar96;
          auVar12._8_4_ = fVar117;
          auVar12._12_4_ = fVar118;
          auVar58 = vshufps_avx(auVar12,auVar12,0xff);
          auVar134._0_4_ = fVar147 * auVar58._0_4_;
          auVar134._4_4_ = fVar148 * auVar58._4_4_;
          auVar134._8_4_ = fVar149 * auVar58._8_4_;
          auVar134._12_4_ = fVar150 * auVar58._12_4_;
          auVar61 = vsubps_avx(auVar12,auVar134);
          auVar12 = vshufps_avx(auVar39,auVar39,0xff);
          auVar38._0_4_ =
               auVar12._0_4_ * fVar147 +
               auVar58._0_4_ * auVar88._0_4_ * auVar33._0_4_ * auVar63._0_4_;
          auVar38._4_4_ =
               auVar12._4_4_ * fVar148 +
               auVar58._4_4_ * auVar88._4_4_ * auVar33._4_4_ * auVar63._4_4_;
          auVar38._8_4_ =
               auVar12._8_4_ * fVar149 +
               auVar58._8_4_ * auVar88._8_4_ * auVar33._8_4_ * auVar63._8_4_;
          auVar38._12_4_ =
               auVar12._12_4_ * fVar150 +
               auVar58._12_4_ * auVar88._12_4_ * auVar33._12_4_ * auVar63._12_4_;
          auVar63 = vsubps_avx(auVar39,auVar38);
          fVar96 = fVar96 + auVar134._0_4_;
          fVar116 = fVar116 + auVar134._4_4_;
          fVar117 = fVar117 + auVar134._8_4_;
          fVar118 = fVar118 + auVar134._12_4_;
          auVar39._0_4_ = auVar143._0_4_ + auVar152._0_4_ * 0.33333334;
          auVar39._4_4_ = auVar143._4_4_ + auVar152._4_4_ * 0.33333334;
          auVar39._8_4_ = auVar143._8_4_ + auVar152._8_4_ * 0.33333334;
          auVar39._12_4_ = auVar143._12_4_ + auVar152._12_4_ * 0.33333334;
          auVar103._0_4_ = auVar63._0_4_ * 0.33333334;
          auVar103._4_4_ = auVar63._4_4_ * 0.33333334;
          auVar103._8_4_ = auVar63._8_4_ * 0.33333334;
          auVar103._12_4_ = auVar63._12_4_ * 0.33333334;
          auVar12 = vsubps_avx(auVar61,auVar103);
          auVar63 = vshufps_avx(auVar12,auVar12,0);
          auVar58 = vshufps_avx(auVar12,auVar12,0x55);
          auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
          auVar88 = vshufps_avx(auVar61,auVar61,0);
          auVar152 = vshufps_avx(auVar61,auVar61,0x55);
          auVar33 = vshufps_avx(auVar61,auVar61,0xaa);
          fVar195 = auVar88._0_4_;
          fVar197 = auVar88._4_4_;
          fVar202 = auVar88._8_4_;
          fVar204 = auVar88._12_4_;
          fVar174 = auVar152._0_4_;
          fVar179 = auVar152._4_4_;
          fVar182 = auVar152._8_4_;
          fVar185 = auVar152._12_4_;
          fVar188 = auVar33._0_4_;
          fVar191 = auVar33._4_4_;
          fVar193 = auVar33._8_4_;
          fVar215 = auVar63._0_4_;
          fVar218 = auVar63._4_4_;
          fVar219 = auVar63._8_4_;
          fVar220 = auVar63._12_4_;
          fVar164 = auVar58._0_4_;
          fVar180 = auVar58._4_4_;
          fVar183 = auVar58._8_4_;
          fVar186 = auVar58._12_4_;
          fVar149 = auVar12._0_4_;
          fVar150 = auVar12._4_4_;
          fVar160 = auVar12._8_4_;
          fVar162 = auVar12._12_4_;
          auVar63 = vshufps_avx(auVar39,auVar39,0);
          fVar206 = auVar63._0_4_;
          fVar210 = auVar63._4_4_;
          fVar212 = auVar63._8_4_;
          auVar58 = vshufps_avx(auVar39,auVar39,0x55);
          fVar178 = auVar58._0_4_;
          fVar184 = auVar58._4_4_;
          fVar190 = auVar58._8_4_;
          fVar194 = auVar58._12_4_;
          auVar58 = vshufps_avx(auVar39,auVar39,0xaa);
          fVar211 = auVar58._0_4_;
          fVar214 = auVar58._4_4_;
          fVar161 = auVar58._8_4_;
          auVar12 = vshufps_avx(auVar143,auVar143,0);
          fVar72 = auVar12._0_4_;
          fVar137 = auVar12._4_4_;
          fVar147 = auVar12._8_4_;
          fVar148 = auVar12._12_4_;
          local_168._0_4_ =
               fVar72 * (float)bezier_basis0._476_4_ +
               fVar206 * (float)bezier_basis0._1632_4_ +
               fVar215 * (float)bezier_basis0._2788_4_ + fVar195 * (float)bezier_basis0._3944_4_;
          local_168._4_4_ =
               fVar137 * (float)bezier_basis0._480_4_ +
               fVar210 * (float)bezier_basis0._1636_4_ +
               fVar218 * (float)bezier_basis0._2792_4_ + fVar197 * (float)bezier_basis0._3948_4_;
          fStack_160 = fVar147 * (float)bezier_basis0._484_4_ +
                       fVar212 * (float)bezier_basis0._1640_4_ +
                       fVar219 * (float)bezier_basis0._2796_4_ +
                       fVar202 * (float)bezier_basis0._3952_4_;
          fStack_15c = fVar148 * (float)bezier_basis0._488_4_ +
                       auVar63._12_4_ * (float)bezier_basis0._1644_4_ +
                       fVar220 * (float)bezier_basis0._2800_4_ +
                       fVar204 * (float)bezier_basis0._3956_4_;
          fStack_158 = fVar72 * (float)bezier_basis0._492_4_ +
                       fVar206 * (float)bezier_basis0._1648_4_ +
                       fVar215 * (float)bezier_basis0._2804_4_ +
                       fVar195 * (float)bezier_basis0._3960_4_;
          fStack_154 = fVar137 * (float)bezier_basis0._496_4_ +
                       fVar210 * (float)bezier_basis0._1652_4_ +
                       fVar218 * (float)bezier_basis0._2808_4_ +
                       fVar197 * (float)bezier_basis0._3964_4_;
          fStack_150 = fVar147 * (float)bezier_basis0._500_4_ +
                       fVar212 * (float)bezier_basis0._1656_4_ +
                       fVar219 * (float)bezier_basis0._2812_4_ +
                       fVar202 * (float)bezier_basis0._3968_4_;
          fStack_14c = (float)bezier_basis0._1660_4_ + 0.0;
          auVar12 = vshufps_avx(auVar143,auVar143,0x55);
          fVar56 = auVar12._0_4_;
          fVar70 = auVar12._4_4_;
          fVar71 = auVar12._8_4_;
          auVar65._0_4_ =
               fVar56 * (float)bezier_basis0._476_4_ +
               fVar178 * (float)bezier_basis0._1632_4_ +
               fVar164 * (float)bezier_basis0._2788_4_ + fVar174 * (float)bezier_basis0._3944_4_;
          auVar65._4_4_ =
               fVar70 * (float)bezier_basis0._480_4_ +
               fVar184 * (float)bezier_basis0._1636_4_ +
               fVar180 * (float)bezier_basis0._2792_4_ + fVar179 * (float)bezier_basis0._3948_4_;
          auVar65._8_4_ =
               fVar71 * (float)bezier_basis0._484_4_ +
               fVar190 * (float)bezier_basis0._1640_4_ +
               fVar183 * (float)bezier_basis0._2796_4_ + fVar182 * (float)bezier_basis0._3952_4_;
          auVar65._12_4_ =
               auVar12._12_4_ * (float)bezier_basis0._488_4_ +
               fVar194 * (float)bezier_basis0._1644_4_ +
               fVar186 * (float)bezier_basis0._2800_4_ + fVar185 * (float)bezier_basis0._3956_4_;
          auVar65._16_4_ =
               fVar56 * (float)bezier_basis0._492_4_ +
               fVar178 * (float)bezier_basis0._1648_4_ +
               fVar164 * (float)bezier_basis0._2804_4_ + fVar174 * (float)bezier_basis0._3960_4_;
          auVar65._20_4_ =
               fVar70 * (float)bezier_basis0._496_4_ +
               fVar184 * (float)bezier_basis0._1652_4_ +
               fVar180 * (float)bezier_basis0._2808_4_ + fVar179 * (float)bezier_basis0._3964_4_;
          auVar65._24_4_ =
               fVar71 * (float)bezier_basis0._500_4_ +
               fVar190 * (float)bezier_basis0._1656_4_ +
               fVar183 * (float)bezier_basis0._2812_4_ + fVar182 * (float)bezier_basis0._3968_4_;
          auVar65._28_4_ = 0;
          auVar88 = vshufps_avx(auVar143,auVar143,0xaa);
          fVar196 = auVar88._0_4_;
          fVar201 = auVar88._4_4_;
          fVar203 = auVar88._8_4_;
          auVar109._0_4_ =
               fVar149 * (float)bezier_basis0._2788_4_ + fVar188 * (float)bezier_basis0._3944_4_ +
               fVar211 * (float)bezier_basis0._1632_4_ + fVar196 * (float)bezier_basis0._476_4_;
          auVar109._4_4_ =
               fVar150 * (float)bezier_basis0._2792_4_ + fVar191 * (float)bezier_basis0._3948_4_ +
               fVar214 * (float)bezier_basis0._1636_4_ + fVar201 * (float)bezier_basis0._480_4_;
          auVar109._8_4_ =
               fVar160 * (float)bezier_basis0._2796_4_ + fVar193 * (float)bezier_basis0._3952_4_ +
               fVar161 * (float)bezier_basis0._1640_4_ + fVar203 * (float)bezier_basis0._484_4_;
          auVar109._12_4_ =
               fVar162 * (float)bezier_basis0._2800_4_ +
               auVar33._12_4_ * (float)bezier_basis0._3956_4_ +
               auVar58._12_4_ * (float)bezier_basis0._1644_4_ +
               auVar88._12_4_ * (float)bezier_basis0._488_4_;
          auVar109._16_4_ =
               fVar149 * (float)bezier_basis0._2804_4_ + fVar188 * (float)bezier_basis0._3960_4_ +
               fVar211 * (float)bezier_basis0._1648_4_ + fVar196 * (float)bezier_basis0._492_4_;
          auVar109._20_4_ =
               fVar150 * (float)bezier_basis0._2808_4_ + fVar191 * (float)bezier_basis0._3964_4_ +
               fVar214 * (float)bezier_basis0._1652_4_ + fVar201 * (float)bezier_basis0._496_4_;
          auVar109._24_4_ =
               fVar160 * (float)bezier_basis0._2812_4_ + fVar193 * (float)bezier_basis0._3968_4_ +
               fVar161 * (float)bezier_basis0._1656_4_ + fVar203 * (float)bezier_basis0._500_4_;
          auVar109._28_4_ = 0;
          fVar136 = fVar194 + fVar185 + fVar186;
          auVar92._0_4_ =
               fVar206 * (float)bezier_basis0._6256_4_ +
               fVar215 * (float)bezier_basis0._7412_4_ + fVar195 * (float)bezier_basis0._8568_4_ +
               fVar72 * (float)bezier_basis0._5100_4_;
          auVar92._4_4_ =
               fVar210 * (float)bezier_basis0._6260_4_ +
               fVar218 * (float)bezier_basis0._7416_4_ + fVar197 * (float)bezier_basis0._8572_4_ +
               fVar137 * (float)bezier_basis0._5104_4_;
          auVar92._8_4_ =
               fVar212 * (float)bezier_basis0._6264_4_ +
               fVar219 * (float)bezier_basis0._7420_4_ + fVar202 * (float)bezier_basis0._8576_4_ +
               fVar147 * (float)bezier_basis0._5108_4_;
          auVar92._12_4_ =
               auVar63._12_4_ * (float)bezier_basis0._6268_4_ +
               fVar220 * (float)bezier_basis0._7424_4_ + fVar204 * (float)bezier_basis0._8580_4_ +
               fVar148 * (float)bezier_basis0._5112_4_;
          auVar92._16_4_ =
               fVar206 * (float)bezier_basis0._6272_4_ +
               fVar215 * (float)bezier_basis0._7428_4_ + fVar195 * (float)bezier_basis0._8584_4_ +
               fVar72 * (float)bezier_basis0._5116_4_;
          auVar92._20_4_ =
               fVar210 * (float)bezier_basis0._6276_4_ +
               fVar218 * (float)bezier_basis0._7432_4_ + fVar197 * (float)bezier_basis0._8588_4_ +
               fVar137 * (float)bezier_basis0._5120_4_;
          auVar92._24_4_ =
               fVar212 * (float)bezier_basis0._6280_4_ +
               fVar219 * (float)bezier_basis0._7436_4_ + fVar202 * (float)bezier_basis0._8592_4_ +
               fVar147 * (float)bezier_basis0._5124_4_;
          auVar92._28_4_ = fVar185 + fVar220 + fVar204 + fVar148;
          auVar47._0_4_ =
               fVar56 * (float)bezier_basis0._5100_4_ +
               fVar178 * (float)bezier_basis0._6256_4_ +
               fVar174 * (float)bezier_basis0._8568_4_ + fVar164 * (float)bezier_basis0._7412_4_;
          auVar47._4_4_ =
               fVar70 * (float)bezier_basis0._5104_4_ +
               fVar184 * (float)bezier_basis0._6260_4_ +
               fVar179 * (float)bezier_basis0._8572_4_ + fVar180 * (float)bezier_basis0._7416_4_;
          auVar47._8_4_ =
               fVar71 * (float)bezier_basis0._5108_4_ +
               fVar190 * (float)bezier_basis0._6264_4_ +
               fVar182 * (float)bezier_basis0._8576_4_ + fVar183 * (float)bezier_basis0._7420_4_;
          auVar47._12_4_ =
               auVar12._12_4_ * (float)bezier_basis0._5112_4_ +
               fVar194 * (float)bezier_basis0._6268_4_ +
               fVar185 * (float)bezier_basis0._8580_4_ + fVar186 * (float)bezier_basis0._7424_4_;
          auVar47._16_4_ =
               fVar56 * (float)bezier_basis0._5116_4_ +
               fVar178 * (float)bezier_basis0._6272_4_ +
               fVar174 * (float)bezier_basis0._8584_4_ + fVar164 * (float)bezier_basis0._7428_4_;
          auVar47._20_4_ =
               fVar70 * (float)bezier_basis0._5120_4_ +
               fVar184 * (float)bezier_basis0._6276_4_ +
               fVar179 * (float)bezier_basis0._8588_4_ + fVar180 * (float)bezier_basis0._7432_4_;
          auVar47._24_4_ =
               fVar71 * (float)bezier_basis0._5124_4_ +
               fVar190 * (float)bezier_basis0._6280_4_ +
               fVar182 * (float)bezier_basis0._8592_4_ + fVar183 * (float)bezier_basis0._7436_4_;
          auVar47._28_4_ = (float)bezier_basis0._6284_4_ + fVar136;
          auVar128._0_4_ =
               fVar196 * (float)bezier_basis0._5100_4_ +
               fVar211 * (float)bezier_basis0._6256_4_ +
               fVar188 * (float)bezier_basis0._8568_4_ + fVar149 * (float)bezier_basis0._7412_4_;
          auVar128._4_4_ =
               fVar201 * (float)bezier_basis0._5104_4_ +
               fVar214 * (float)bezier_basis0._6260_4_ +
               fVar191 * (float)bezier_basis0._8572_4_ + fVar150 * (float)bezier_basis0._7416_4_;
          auVar128._8_4_ =
               fVar203 * (float)bezier_basis0._5108_4_ +
               fVar161 * (float)bezier_basis0._6264_4_ +
               fVar193 * (float)bezier_basis0._8576_4_ + fVar160 * (float)bezier_basis0._7420_4_;
          auVar128._12_4_ =
               auVar88._12_4_ * (float)bezier_basis0._5112_4_ +
               auVar58._12_4_ * (float)bezier_basis0._6268_4_ +
               auVar33._12_4_ * (float)bezier_basis0._8580_4_ +
               fVar162 * (float)bezier_basis0._7424_4_;
          auVar128._16_4_ =
               fVar196 * (float)bezier_basis0._5116_4_ +
               fVar211 * (float)bezier_basis0._6272_4_ +
               fVar188 * (float)bezier_basis0._8584_4_ + fVar149 * (float)bezier_basis0._7428_4_;
          auVar128._20_4_ =
               fVar201 * (float)bezier_basis0._5120_4_ +
               fVar214 * (float)bezier_basis0._6276_4_ +
               fVar191 * (float)bezier_basis0._8588_4_ + fVar150 * (float)bezier_basis0._7432_4_;
          auVar128._24_4_ =
               fVar203 * (float)bezier_basis0._5124_4_ +
               fVar161 * (float)bezier_basis0._6280_4_ +
               fVar193 * (float)bezier_basis0._8592_4_ + fVar160 * (float)bezier_basis0._7436_4_;
          auVar128._28_4_ = fVar136 + fVar194 + fVar185 + fVar162;
          auVar172 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar11 = vblendps_avx(auVar92,auVar172,1);
          auVar172 = vblendps_avx(auVar47,auVar172,1);
          auVar176 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar177 = vblendps_avx(auVar128,auVar176,1);
          auVar170._4_4_ = auVar11._4_4_ * 0.055555556;
          auVar170._0_4_ = auVar11._0_4_ * 0.055555556;
          auVar170._8_4_ = auVar11._8_4_ * 0.055555556;
          auVar170._12_4_ = auVar11._12_4_ * 0.055555556;
          auVar170._16_4_ = auVar11._16_4_ * 0.055555556;
          auVar170._20_4_ = auVar11._20_4_ * 0.055555556;
          auVar170._24_4_ = auVar11._24_4_ * 0.055555556;
          auVar170._28_4_ = auVar11._28_4_;
          auVar11._4_4_ = auVar172._4_4_ * 0.055555556;
          auVar11._0_4_ = auVar172._0_4_ * 0.055555556;
          auVar11._8_4_ = auVar172._8_4_ * 0.055555556;
          auVar11._12_4_ = auVar172._12_4_ * 0.055555556;
          auVar11._16_4_ = auVar172._16_4_ * 0.055555556;
          auVar11._20_4_ = auVar172._20_4_ * 0.055555556;
          auVar11._24_4_ = auVar172._24_4_ * 0.055555556;
          auVar11._28_4_ = auVar172._28_4_;
          auVar172._4_4_ = auVar177._4_4_ * 0.055555556;
          auVar172._0_4_ = auVar177._0_4_ * 0.055555556;
          auVar172._8_4_ = auVar177._8_4_ * 0.055555556;
          auVar172._12_4_ = auVar177._12_4_ * 0.055555556;
          auVar172._16_4_ = auVar177._16_4_ * 0.055555556;
          auVar172._20_4_ = auVar177._20_4_ * 0.055555556;
          auVar172._24_4_ = auVar177._24_4_ * 0.055555556;
          auVar172._28_4_ = auVar177._28_4_;
          auVar170 = vsubps_avx(_local_168,auVar170);
          auVar93 = vsubps_avx(auVar65,auVar11);
          auVar16 = vsubps_avx(auVar109,auVar172);
          auVar11 = vblendps_avx(auVar92,auVar176,0x80);
          auVar172 = vblendps_avx(auVar47,auVar176,0x80);
          auVar177 = vblendps_avx(auVar128,auVar176,0x80);
          auVar169._0_4_ = (float)local_168._0_4_ + auVar11._0_4_ * 0.055555556;
          auVar169._4_4_ = (float)local_168._4_4_ + auVar11._4_4_ * 0.055555556;
          auVar169._8_4_ = fStack_160 + auVar11._8_4_ * 0.055555556;
          auVar169._12_4_ = fStack_15c + auVar11._12_4_ * 0.055555556;
          auVar169._16_4_ = fStack_158 + auVar11._16_4_ * 0.055555556;
          auVar169._20_4_ = fStack_154 + auVar11._20_4_ * 0.055555556;
          auVar169._24_4_ = fStack_150 + auVar11._24_4_ * 0.055555556;
          auVar169._28_4_ = (float)bezier_basis0._1660_4_ + 0.0 + auVar11._28_4_;
          auVar48._0_4_ = auVar65._0_4_ + auVar172._0_4_ * 0.055555556;
          auVar48._4_4_ = auVar65._4_4_ + auVar172._4_4_ * 0.055555556;
          auVar48._8_4_ = auVar65._8_4_ + auVar172._8_4_ * 0.055555556;
          auVar48._12_4_ = auVar65._12_4_ + auVar172._12_4_ * 0.055555556;
          auVar48._16_4_ = auVar65._16_4_ + auVar172._16_4_ * 0.055555556;
          auVar48._20_4_ = auVar65._20_4_ + auVar172._20_4_ * 0.055555556;
          auVar48._24_4_ = auVar65._24_4_ + auVar172._24_4_ * 0.055555556;
          auVar48._28_4_ = auVar172._28_4_ + 0.0;
          auVar129._0_4_ = auVar109._0_4_ + auVar177._0_4_ * 0.055555556;
          auVar129._4_4_ = auVar109._4_4_ + auVar177._4_4_ * 0.055555556;
          auVar129._8_4_ = auVar109._8_4_ + auVar177._8_4_ * 0.055555556;
          auVar129._12_4_ = auVar109._12_4_ + auVar177._12_4_ * 0.055555556;
          auVar129._16_4_ = auVar109._16_4_ + auVar177._16_4_ * 0.055555556;
          auVar129._20_4_ = auVar109._20_4_ + auVar177._20_4_ * 0.055555556;
          auVar129._24_4_ = auVar109._24_4_ + auVar177._24_4_ * 0.055555556;
          auVar129._28_4_ = auVar177._28_4_ + 0.0;
          auVar83._8_4_ = 0x7f800000;
          auVar83._0_8_ = 0x7f8000007f800000;
          auVar83._12_4_ = 0x7f800000;
          auVar83._16_4_ = 0x7f800000;
          auVar83._20_4_ = 0x7f800000;
          auVar83._24_4_ = 0x7f800000;
          auVar83._28_4_ = 0x7f800000;
          auVar11 = vminps_avx(auVar83,_local_168);
          auVar172 = vminps_avx(auVar83,auVar65);
          auVar177 = vminps_avx(auVar170,auVar169);
          auVar176 = vminps_avx(auVar11,auVar177);
          auVar11 = vminps_avx(auVar93,auVar48);
          auVar15 = vminps_avx(auVar172,auVar11);
          auVar11 = vminps_avx(auVar83,auVar109);
          auVar172 = vminps_avx(auVar16,auVar129);
          auVar198 = vminps_avx(auVar11,auVar172);
          auVar221._0_4_ = (fVar173 + auVar62._0_4_) * 0.33333334 + fVar32;
          auVar221._4_4_ = (fVar181 + auVar62._4_4_) * 0.33333334 + fVar53;
          auVar221._8_4_ = (fVar187 + auVar62._8_4_) * 0.33333334 + fVar54;
          auVar221._12_4_ = (fVar192 + auVar62._12_4_) * 0.33333334 + fVar55;
          auVar88._0_4_ = (fVar205 + auVar38._0_4_) * 0.33333334;
          auVar88._4_4_ = (fVar213 + auVar38._4_4_) * 0.33333334;
          auVar88._8_4_ = (fVar151 + auVar38._8_4_) * 0.33333334;
          auVar88._12_4_ = (fVar163 + auVar38._12_4_) * 0.33333334;
          auVar63._4_4_ = fVar116;
          auVar63._0_4_ = fVar96;
          auVar63._8_4_ = fVar117;
          auVar63._12_4_ = fVar118;
          auVar39 = vsubps_avx(auVar63,auVar88);
          auVar208._8_4_ = 0xff800000;
          auVar208._0_8_ = 0xff800000ff800000;
          auVar208._12_4_ = 0xff800000;
          auVar208._16_4_ = 0xff800000;
          auVar208._20_4_ = 0xff800000;
          auVar208._24_4_ = 0xff800000;
          auVar208._28_4_ = 0xff800000;
          auVar11 = vmaxps_avx(auVar208,_local_168);
          auVar172 = vmaxps_avx(auVar208,auVar65);
          auVar177 = vmaxps_avx(auVar208,auVar109);
          auVar170 = vmaxps_avx(auVar170,auVar169);
          auVar11 = vmaxps_avx(auVar11,auVar170);
          auVar170 = vmaxps_avx(auVar93,auVar48);
          auVar172 = vmaxps_avx(auVar172,auVar170);
          auVar170 = vmaxps_avx(auVar16,auVar129);
          auVar177 = vmaxps_avx(auVar177,auVar170);
          auVar170 = vshufps_avx(auVar176,auVar176,0xb1);
          auVar170 = vminps_avx(auVar176,auVar170);
          auVar176 = vshufpd_avx(auVar170,auVar170,5);
          auVar170 = vminps_avx(auVar170,auVar176);
          auVar63 = vminps_avx(auVar170._0_16_,auVar170._16_16_);
          auVar170 = vshufps_avx(auVar15,auVar15,0xb1);
          auVar170 = vminps_avx(auVar15,auVar170);
          auVar176 = vshufpd_avx(auVar170,auVar170,5);
          auVar170 = vminps_avx(auVar170,auVar176);
          auVar58 = vminps_avx(auVar170._0_16_,auVar170._16_16_);
          auVar58 = vunpcklps_avx(auVar63,auVar58);
          auVar170 = vshufps_avx(auVar198,auVar198,0xb1);
          auVar170 = vminps_avx(auVar198,auVar170);
          auVar176 = vshufpd_avx(auVar170,auVar170,5);
          auVar170 = vminps_avx(auVar170,auVar176);
          auVar63 = vminps_avx(auVar170._0_16_,auVar170._16_16_);
          auVar63 = vinsertps_avx(auVar58,auVar63,0x28);
          auVar170 = vshufps_avx(auVar11,auVar11,0xb1);
          auVar11 = vmaxps_avx(auVar11,auVar170);
          auVar170 = vshufpd_avx(auVar11,auVar11,5);
          auVar11 = vmaxps_avx(auVar11,auVar170);
          auVar58 = vmaxps_avx(auVar11._0_16_,auVar11._16_16_);
          auVar11 = vshufps_avx(auVar172,auVar172,0xb1);
          auVar11 = vmaxps_avx(auVar172,auVar11);
          auVar172 = vshufpd_avx(auVar11,auVar11,5);
          auVar11 = vmaxps_avx(auVar11,auVar172);
          auVar12 = vmaxps_avx(auVar11._0_16_,auVar11._16_16_);
          auVar12 = vunpcklps_avx(auVar58,auVar12);
          auVar11 = vshufps_avx(auVar177,auVar177,0xb1);
          auVar11 = vmaxps_avx(auVar177,auVar11);
          auVar172 = vshufpd_avx(auVar11,auVar11,5);
          auVar11 = vmaxps_avx(auVar11,auVar172);
          auVar58 = vmaxps_avx(auVar11._0_16_,auVar11._16_16_);
          auVar58 = vinsertps_avx(auVar12,auVar58,0x28);
          auVar12 = vshufps_avx(auVar221,auVar221,0);
          auVar88 = vshufps_avx(auVar221,auVar221,0x55);
          auVar152 = vshufps_avx(auVar221,auVar221,0xaa);
          auVar33 = vshufps_avx(auVar39,auVar39,0);
          auVar61 = vshufps_avx(auVar39,auVar39,0x55);
          auVar39 = vshufps_avx(auVar39,auVar39,0xaa);
          auVar143._4_4_ = fVar116;
          auVar143._0_4_ = fVar96;
          auVar143._8_4_ = fVar117;
          auVar143._12_4_ = fVar118;
          auVar38 = vshufps_avx(auVar143,auVar143,0);
          auVar34 = vshufps_avx(auVar143,auVar143,0x55);
          auVar143 = vshufps_avx(auVar143,auVar143,0xaa);
          fVar201 = auVar38._0_4_;
          fVar203 = auVar38._4_4_;
          fVar205 = auVar38._8_4_;
          fVar184 = auVar34._0_4_;
          fVar187 = auVar34._4_4_;
          fVar190 = auVar34._8_4_;
          fVar192 = auVar143._0_4_;
          fVar194 = auVar143._4_4_;
          fVar196 = auVar143._8_4_;
          fVar118 = auVar33._0_4_;
          fVar137 = auVar33._4_4_;
          fVar147 = auVar33._8_4_;
          fVar148 = auVar33._12_4_;
          fVar149 = auVar61._0_4_;
          fVar150 = auVar61._4_4_;
          fVar160 = auVar61._8_4_;
          fVar162 = auVar61._12_4_;
          fVar164 = auVar39._0_4_;
          fVar180 = auVar39._4_4_;
          fVar183 = auVar39._8_4_;
          fVar186 = auVar39._12_4_;
          fVar136 = auVar12._0_4_;
          fVar173 = auVar12._4_4_;
          fVar178 = auVar12._8_4_;
          fVar181 = auVar12._12_4_;
          fVar96 = auVar88._0_4_;
          fVar116 = auVar88._4_4_;
          fVar117 = auVar88._8_4_;
          fVar211 = auVar152._0_4_;
          fVar213 = auVar152._4_4_;
          fVar214 = auVar152._8_4_;
          auVar61._4_4_ = fVar53;
          auVar61._0_4_ = fVar32;
          auVar61._8_4_ = fVar54;
          auVar61._12_4_ = fVar55;
          auVar12 = vshufps_avx(auVar61,auVar61,0);
          fVar151 = auVar12._0_4_;
          fVar161 = auVar12._4_4_;
          fVar163 = auVar12._8_4_;
          auVar84._0_4_ =
               fVar151 * (float)bezier_basis0._476_4_ +
               fVar136 * (float)bezier_basis0._1632_4_ +
               fVar118 * (float)bezier_basis0._2788_4_ + fVar201 * (float)bezier_basis0._3944_4_;
          auVar84._4_4_ =
               fVar161 * (float)bezier_basis0._480_4_ +
               fVar173 * (float)bezier_basis0._1636_4_ +
               fVar137 * (float)bezier_basis0._2792_4_ + fVar203 * (float)bezier_basis0._3948_4_;
          auVar84._8_4_ =
               fVar163 * (float)bezier_basis0._484_4_ +
               fVar178 * (float)bezier_basis0._1640_4_ +
               fVar147 * (float)bezier_basis0._2796_4_ + fVar205 * (float)bezier_basis0._3952_4_;
          auVar84._12_4_ =
               auVar12._12_4_ * (float)bezier_basis0._488_4_ +
               fVar181 * (float)bezier_basis0._1644_4_ +
               fVar148 * (float)bezier_basis0._2800_4_ +
               auVar38._12_4_ * (float)bezier_basis0._3956_4_;
          auVar84._16_4_ =
               fVar151 * (float)bezier_basis0._492_4_ +
               fVar136 * (float)bezier_basis0._1648_4_ +
               fVar118 * (float)bezier_basis0._2804_4_ + fVar201 * (float)bezier_basis0._3960_4_;
          auVar84._20_4_ =
               fVar161 * (float)bezier_basis0._496_4_ +
               fVar173 * (float)bezier_basis0._1652_4_ +
               fVar137 * (float)bezier_basis0._2808_4_ + fVar203 * (float)bezier_basis0._3964_4_;
          auVar84._24_4_ =
               fVar163 * (float)bezier_basis0._500_4_ +
               fVar178 * (float)bezier_basis0._1656_4_ +
               fVar147 * (float)bezier_basis0._2812_4_ + fVar205 * (float)bezier_basis0._3968_4_;
          auVar84._28_4_ = 0xff800000;
          auVar33 = vshufps_avx(auVar61,auVar61,0x55);
          fVar56 = auVar33._0_4_;
          fVar70 = auVar33._4_4_;
          fVar71 = auVar33._8_4_;
          fVar72 = auVar33._12_4_;
          auVar158._0_4_ =
               fVar56 * (float)bezier_basis0._476_4_ +
               fVar96 * (float)bezier_basis0._1632_4_ +
               fVar149 * (float)bezier_basis0._2788_4_ + fVar184 * (float)bezier_basis0._3944_4_;
          auVar158._4_4_ =
               fVar70 * (float)bezier_basis0._480_4_ +
               fVar116 * (float)bezier_basis0._1636_4_ +
               fVar150 * (float)bezier_basis0._2792_4_ + fVar187 * (float)bezier_basis0._3948_4_;
          auVar158._8_4_ =
               fVar71 * (float)bezier_basis0._484_4_ +
               fVar117 * (float)bezier_basis0._1640_4_ +
               fVar160 * (float)bezier_basis0._2796_4_ + fVar190 * (float)bezier_basis0._3952_4_;
          auVar158._12_4_ =
               fVar72 * (float)bezier_basis0._488_4_ +
               auVar88._12_4_ * (float)bezier_basis0._1644_4_ +
               fVar162 * (float)bezier_basis0._2800_4_ +
               auVar34._12_4_ * (float)bezier_basis0._3956_4_;
          auVar158._16_4_ =
               fVar56 * (float)bezier_basis0._492_4_ +
               fVar96 * (float)bezier_basis0._1648_4_ +
               fVar149 * (float)bezier_basis0._2804_4_ + fVar184 * (float)bezier_basis0._3960_4_;
          auVar158._20_4_ =
               fVar70 * (float)bezier_basis0._496_4_ +
               fVar116 * (float)bezier_basis0._1652_4_ +
               fVar150 * (float)bezier_basis0._2808_4_ + fVar187 * (float)bezier_basis0._3964_4_;
          auVar158._24_4_ =
               fVar71 * (float)bezier_basis0._500_4_ +
               fVar117 * (float)bezier_basis0._1656_4_ +
               fVar160 * (float)bezier_basis0._2812_4_ + fVar190 * (float)bezier_basis0._3968_4_;
          auVar158._28_4_ = 0xff800000;
          auVar33 = vshufps_avx(auVar61,auVar61,0xaa);
          fVar53 = auVar33._0_4_;
          fVar54 = auVar33._4_4_;
          fVar55 = auVar33._8_4_;
          auVar209._0_4_ =
               fVar53 * (float)bezier_basis0._476_4_ +
               fVar211 * (float)bezier_basis0._1632_4_ +
               fVar164 * (float)bezier_basis0._2788_4_ + fVar192 * (float)bezier_basis0._3944_4_;
          auVar209._4_4_ =
               fVar54 * (float)bezier_basis0._480_4_ +
               fVar213 * (float)bezier_basis0._1636_4_ +
               fVar180 * (float)bezier_basis0._2792_4_ + fVar194 * (float)bezier_basis0._3948_4_;
          auVar209._8_4_ =
               fVar55 * (float)bezier_basis0._484_4_ +
               fVar214 * (float)bezier_basis0._1640_4_ +
               fVar183 * (float)bezier_basis0._2796_4_ + fVar196 * (float)bezier_basis0._3952_4_;
          auVar209._12_4_ =
               auVar33._12_4_ * (float)bezier_basis0._488_4_ +
               auVar152._12_4_ * (float)bezier_basis0._1644_4_ +
               fVar186 * (float)bezier_basis0._2800_4_ +
               auVar143._12_4_ * (float)bezier_basis0._3956_4_;
          auVar209._16_4_ =
               fVar53 * (float)bezier_basis0._492_4_ +
               fVar211 * (float)bezier_basis0._1648_4_ +
               fVar164 * (float)bezier_basis0._2804_4_ + fVar192 * (float)bezier_basis0._3960_4_;
          auVar209._20_4_ =
               fVar54 * (float)bezier_basis0._496_4_ +
               fVar213 * (float)bezier_basis0._1652_4_ +
               fVar180 * (float)bezier_basis0._2808_4_ + fVar194 * (float)bezier_basis0._3964_4_;
          auVar209._24_4_ =
               fVar55 * (float)bezier_basis0._500_4_ +
               fVar214 * (float)bezier_basis0._1656_4_ +
               fVar183 * (float)bezier_basis0._2812_4_ + fVar196 * (float)bezier_basis0._3968_4_;
          auVar209._28_4_ = auVar16._28_4_ + -INFINITY + -INFINITY + 0.0;
          fVar32 = (float)bezier_basis0._8596_4_ + fVar162 + 0.0;
          auVar110._0_4_ =
               fVar151 * (float)bezier_basis0._5100_4_ +
               (float)bezier_basis0._6256_4_ * fVar136 +
               fVar201 * (float)bezier_basis0._8568_4_ + (float)bezier_basis0._7412_4_ * fVar118;
          auVar110._4_4_ =
               fVar161 * (float)bezier_basis0._5104_4_ +
               (float)bezier_basis0._6260_4_ * fVar173 +
               fVar203 * (float)bezier_basis0._8572_4_ + (float)bezier_basis0._7416_4_ * fVar137;
          auVar110._8_4_ =
               fVar163 * (float)bezier_basis0._5108_4_ +
               (float)bezier_basis0._6264_4_ * fVar178 +
               fVar205 * (float)bezier_basis0._8576_4_ + (float)bezier_basis0._7420_4_ * fVar147;
          auVar110._12_4_ =
               auVar12._12_4_ * (float)bezier_basis0._5112_4_ +
               (float)bezier_basis0._6268_4_ * fVar181 +
               auVar38._12_4_ * (float)bezier_basis0._8580_4_ +
               (float)bezier_basis0._7424_4_ * fVar148;
          auVar110._16_4_ =
               fVar151 * (float)bezier_basis0._5116_4_ +
               (float)bezier_basis0._6272_4_ * fVar136 +
               fVar201 * (float)bezier_basis0._8584_4_ + (float)bezier_basis0._7428_4_ * fVar118;
          auVar110._20_4_ =
               fVar161 * (float)bezier_basis0._5120_4_ +
               (float)bezier_basis0._6276_4_ * fVar173 +
               fVar203 * (float)bezier_basis0._8588_4_ + (float)bezier_basis0._7432_4_ * fVar137;
          auVar110._24_4_ =
               fVar163 * (float)bezier_basis0._5124_4_ +
               (float)bezier_basis0._6280_4_ * fVar178 +
               fVar205 * (float)bezier_basis0._8592_4_ + (float)bezier_basis0._7436_4_ * fVar147;
          auVar110._28_4_ = fVar186 + 0.0 + fVar181 + fVar148 + 0.0;
          auVar49._0_4_ =
               fVar56 * (float)bezier_basis0._5100_4_ +
               (float)bezier_basis0._6256_4_ * fVar96 +
               fVar184 * (float)bezier_basis0._8568_4_ + (float)bezier_basis0._7412_4_ * fVar149;
          auVar49._4_4_ =
               fVar70 * (float)bezier_basis0._5104_4_ +
               (float)bezier_basis0._6260_4_ * fVar116 +
               fVar187 * (float)bezier_basis0._8572_4_ + (float)bezier_basis0._7416_4_ * fVar150;
          auVar49._8_4_ =
               fVar71 * (float)bezier_basis0._5108_4_ +
               (float)bezier_basis0._6264_4_ * fVar117 +
               fVar190 * (float)bezier_basis0._8576_4_ + (float)bezier_basis0._7420_4_ * fVar160;
          auVar49._12_4_ =
               fVar72 * (float)bezier_basis0._5112_4_ +
               (float)bezier_basis0._6268_4_ * auVar88._12_4_ +
               auVar34._12_4_ * (float)bezier_basis0._8580_4_ +
               (float)bezier_basis0._7424_4_ * fVar162;
          auVar49._16_4_ =
               fVar56 * (float)bezier_basis0._5116_4_ +
               (float)bezier_basis0._6272_4_ * fVar96 +
               fVar184 * (float)bezier_basis0._8584_4_ + (float)bezier_basis0._7428_4_ * fVar149;
          auVar49._20_4_ =
               fVar70 * (float)bezier_basis0._5120_4_ +
               (float)bezier_basis0._6276_4_ * fVar116 +
               fVar187 * (float)bezier_basis0._8588_4_ + (float)bezier_basis0._7432_4_ * fVar150;
          auVar49._24_4_ =
               fVar71 * (float)bezier_basis0._5124_4_ +
               (float)bezier_basis0._6280_4_ * fVar117 +
               fVar190 * (float)bezier_basis0._8592_4_ + (float)bezier_basis0._7436_4_ * fVar160;
          auVar49._28_4_ = fVar72 + fVar32;
          auVar66._0_4_ =
               fVar53 * (float)bezier_basis0._5100_4_ +
               fVar211 * (float)bezier_basis0._6256_4_ +
               fVar192 * (float)bezier_basis0._8568_4_ + (float)bezier_basis0._7412_4_ * fVar164;
          auVar66._4_4_ =
               fVar54 * (float)bezier_basis0._5104_4_ +
               fVar213 * (float)bezier_basis0._6260_4_ +
               fVar194 * (float)bezier_basis0._8572_4_ + (float)bezier_basis0._7416_4_ * fVar180;
          auVar66._8_4_ =
               fVar55 * (float)bezier_basis0._5108_4_ +
               fVar214 * (float)bezier_basis0._6264_4_ +
               fVar196 * (float)bezier_basis0._8576_4_ + (float)bezier_basis0._7420_4_ * fVar183;
          auVar66._12_4_ =
               auVar33._12_4_ * (float)bezier_basis0._5112_4_ +
               auVar152._12_4_ * (float)bezier_basis0._6268_4_ +
               auVar143._12_4_ * (float)bezier_basis0._8580_4_ +
               (float)bezier_basis0._7424_4_ * fVar186;
          auVar66._16_4_ =
               fVar53 * (float)bezier_basis0._5116_4_ +
               fVar211 * (float)bezier_basis0._6272_4_ +
               fVar192 * (float)bezier_basis0._8584_4_ + (float)bezier_basis0._7428_4_ * fVar164;
          auVar66._20_4_ =
               fVar54 * (float)bezier_basis0._5120_4_ +
               fVar213 * (float)bezier_basis0._6276_4_ +
               fVar194 * (float)bezier_basis0._8588_4_ + (float)bezier_basis0._7432_4_ * fVar180;
          auVar66._24_4_ =
               fVar55 * (float)bezier_basis0._5124_4_ +
               fVar214 * (float)bezier_basis0._6280_4_ +
               fVar196 * (float)bezier_basis0._8592_4_ + (float)bezier_basis0._7436_4_ * fVar183;
          auVar66._28_4_ = fVar32 + fVar162 + 0.0 + fVar186 + 0.0;
          auVar11 = vblendps_avx(auVar110,ZEXT832(0) << 0x20,1);
          auVar172 = vblendps_avx(auVar49,ZEXT832(0) << 0x20,1);
          auVar170 = ZEXT832(0) << 0x20;
          auVar177 = vblendps_avx(auVar66,auVar170,1);
          auVar176._4_4_ = auVar11._4_4_ * 0.055555556;
          auVar176._0_4_ = auVar11._0_4_ * 0.055555556;
          auVar176._8_4_ = auVar11._8_4_ * 0.055555556;
          auVar176._12_4_ = auVar11._12_4_ * 0.055555556;
          auVar176._16_4_ = auVar11._16_4_ * 0.055555556;
          auVar176._20_4_ = auVar11._20_4_ * 0.055555556;
          auVar176._24_4_ = auVar11._24_4_ * 0.055555556;
          auVar176._28_4_ = auVar11._28_4_;
          auVar15._4_4_ = auVar172._4_4_ * 0.055555556;
          auVar15._0_4_ = auVar172._0_4_ * 0.055555556;
          auVar15._8_4_ = auVar172._8_4_ * 0.055555556;
          auVar15._12_4_ = auVar172._12_4_ * 0.055555556;
          auVar15._16_4_ = auVar172._16_4_ * 0.055555556;
          auVar15._20_4_ = auVar172._20_4_ * 0.055555556;
          auVar15._24_4_ = auVar172._24_4_ * 0.055555556;
          auVar15._28_4_ = auVar172._28_4_;
          auVar198._4_4_ = auVar177._4_4_ * 0.055555556;
          auVar198._0_4_ = auVar177._0_4_ * 0.055555556;
          auVar198._8_4_ = auVar177._8_4_ * 0.055555556;
          auVar198._12_4_ = auVar177._12_4_ * 0.055555556;
          auVar198._16_4_ = auVar177._16_4_ * 0.055555556;
          auVar198._20_4_ = auVar177._20_4_ * 0.055555556;
          auVar198._24_4_ = auVar177._24_4_ * 0.055555556;
          auVar198._28_4_ = auVar177._28_4_;
          auVar93 = vsubps_avx(auVar84,auVar176);
          auVar16 = vsubps_avx(auVar158,auVar15);
          auVar47 = vsubps_avx(auVar209,auVar198);
          auVar11 = vblendps_avx(auVar110,auVar170,0x80);
          auVar172 = vblendps_avx(auVar49,auVar170,0x80);
          auVar177 = vblendps_avx(auVar66,auVar170,0x80);
          auVar111._0_4_ = auVar84._0_4_ + auVar11._0_4_ * 0.055555556;
          auVar111._4_4_ = auVar84._4_4_ + auVar11._4_4_ * 0.055555556;
          auVar111._8_4_ = auVar84._8_4_ + auVar11._8_4_ * 0.055555556;
          auVar111._12_4_ = auVar84._12_4_ + auVar11._12_4_ * 0.055555556;
          auVar111._16_4_ = auVar84._16_4_ + auVar11._16_4_ * 0.055555556;
          auVar111._20_4_ = auVar84._20_4_ + auVar11._20_4_ * 0.055555556;
          auVar111._24_4_ = auVar84._24_4_ + auVar11._24_4_ * 0.055555556;
          auVar111._28_4_ = auVar11._28_4_ + -INFINITY;
          auVar50._0_4_ = auVar158._0_4_ + auVar172._0_4_ * 0.055555556;
          auVar50._4_4_ = auVar158._4_4_ + auVar172._4_4_ * 0.055555556;
          auVar50._8_4_ = auVar158._8_4_ + auVar172._8_4_ * 0.055555556;
          auVar50._12_4_ = auVar158._12_4_ + auVar172._12_4_ * 0.055555556;
          auVar50._16_4_ = auVar158._16_4_ + auVar172._16_4_ * 0.055555556;
          auVar50._20_4_ = auVar158._20_4_ + auVar172._20_4_ * 0.055555556;
          auVar50._24_4_ = auVar158._24_4_ + auVar172._24_4_ * 0.055555556;
          auVar50._28_4_ = auVar172._28_4_ + -INFINITY;
          auVar144._0_4_ = auVar209._0_4_ + auVar177._0_4_ * 0.055555556;
          auVar144._4_4_ = auVar209._4_4_ + auVar177._4_4_ * 0.055555556;
          auVar144._8_4_ = auVar209._8_4_ + auVar177._8_4_ * 0.055555556;
          auVar144._12_4_ = auVar209._12_4_ + auVar177._12_4_ * 0.055555556;
          auVar144._16_4_ = auVar209._16_4_ + auVar177._16_4_ * 0.055555556;
          auVar144._20_4_ = auVar209._20_4_ + auVar177._20_4_ * 0.055555556;
          auVar144._24_4_ = auVar209._24_4_ + auVar177._24_4_ * 0.055555556;
          auVar144._28_4_ = auVar209._28_4_ + auVar177._28_4_;
          auVar177._8_4_ = 0x7f800000;
          auVar177._0_8_ = 0x7f8000007f800000;
          auVar177._12_4_ = 0x7f800000;
          auVar177._16_4_ = 0x7f800000;
          auVar177._20_4_ = 0x7f800000;
          auVar177._24_4_ = 0x7f800000;
          auVar177._28_4_ = 0x7f800000;
          auVar11 = vminps_avx(auVar177,auVar84);
          auVar172 = vminps_avx(auVar177,auVar158);
          auVar177 = vminps_avx(auVar177,auVar209);
          auVar170 = vminps_avx(auVar93,auVar111);
          auVar176 = vminps_avx(auVar11,auVar170);
          auVar11 = vminps_avx(auVar16,auVar50);
          auVar15 = vminps_avx(auVar172,auVar11);
          auVar11 = vminps_avx(auVar47,auVar144);
          auVar198 = vminps_avx(auVar177,auVar11);
          auVar11 = vmaxps_avx(auVar93,auVar111);
          auVar93._8_4_ = 0xff800000;
          auVar93._0_8_ = 0xff800000ff800000;
          auVar93._12_4_ = 0xff800000;
          auVar93._16_4_ = 0xff800000;
          auVar93._20_4_ = 0xff800000;
          auVar93._24_4_ = 0xff800000;
          auVar93._28_4_ = 0xff800000;
          auVar172 = vmaxps_avx(auVar93,auVar84);
          auVar11 = vmaxps_avx(auVar172,auVar11);
          auVar172 = vmaxps_avx(auVar16,auVar50);
          auVar177 = vmaxps_avx(auVar93,auVar158);
          auVar153._8_4_ = 0xddccb9a2;
          auVar153._0_8_ = 0xddccb9a2ddccb9a2;
          auVar153._12_4_ = 0xddccb9a2;
          auVar159 = ZEXT1664(auVar153);
          auVar172 = vmaxps_avx(auVar177,auVar172);
          auVar177 = vmaxps_avx(auVar47,auVar144);
          auVar139._8_4_ = 0x5dccb9a2;
          auVar139._0_8_ = 0x5dccb9a25dccb9a2;
          auVar139._12_4_ = 0x5dccb9a2;
          auVar146 = ZEXT1664(auVar139);
          auVar170 = vmaxps_avx(auVar93,auVar209);
          auVar177 = vmaxps_avx(auVar170,auVar177);
          auVar170 = vshufps_avx(auVar176,auVar176,0xb1);
          auVar170 = vminps_avx(auVar176,auVar170);
          auVar176 = vshufpd_avx(auVar170,auVar170,5);
          auVar170 = vminps_avx(auVar170,auVar176);
          auVar12 = vminps_avx(auVar170._0_16_,auVar170._16_16_);
          auVar170 = vshufps_avx(auVar15,auVar15,0xb1);
          auVar170 = vminps_avx(auVar15,auVar170);
          auVar176 = vshufpd_avx(auVar170,auVar170,5);
          auVar170 = vminps_avx(auVar170,auVar176);
          auVar88 = vminps_avx(auVar170._0_16_,auVar170._16_16_);
          auVar88 = vunpcklps_avx(auVar12,auVar88);
          auVar170 = vshufps_avx(auVar198,auVar198,0xb1);
          auVar170 = vminps_avx(auVar198,auVar170);
          auVar176 = vshufpd_avx(auVar170,auVar170,5);
          auVar170 = vminps_avx(auVar170,auVar176);
          auVar12 = vminps_avx(auVar170._0_16_,auVar170._16_16_);
          auVar12 = vinsertps_avx(auVar88,auVar12,0x28);
          auVar88 = vminps_avx(auVar63,auVar12);
          auVar170 = vshufps_avx(auVar11,auVar11,0xb1);
          auVar11 = vmaxps_avx(auVar11,auVar170);
          auVar170 = vshufpd_avx(auVar11,auVar11,5);
          auVar11 = vmaxps_avx(auVar11,auVar170);
          auVar63 = vmaxps_avx(auVar11._0_16_,auVar11._16_16_);
          auVar11 = vshufps_avx(auVar172,auVar172,0xb1);
          auVar11 = vmaxps_avx(auVar172,auVar11);
          auVar172 = vshufpd_avx(auVar11,auVar11,5);
          auVar11 = vmaxps_avx(auVar11,auVar172);
          auVar12 = vmaxps_avx(auVar11._0_16_,auVar11._16_16_);
          auVar12 = vunpcklps_avx(auVar63,auVar12);
          auVar11 = vshufps_avx(auVar177,auVar177,0xb1);
          auVar11 = vmaxps_avx(auVar177,auVar11);
          auVar172 = vshufpd_avx(auVar11,auVar11,5);
          auVar11 = vmaxps_avx(auVar11,auVar172);
          auVar63 = vmaxps_avx(auVar11._0_16_,auVar11._16_16_);
          auVar63 = vinsertps_avx(auVar12,auVar63,0x28);
          auVar58 = vmaxps_avx(auVar58,auVar63);
          auVar63 = vcmpps_avx(auVar88,auVar153,6);
          auVar58 = vcmpps_avx(auVar58,auVar139,1);
          auVar63 = vandps_avx(auVar58,auVar63);
          uVar25 = vmovmskps_avx(auVar63);
          if ((~(byte)uVar25 & 7) != 0) goto LAB_01207589;
          lVar27 = lVar27 + 0x38;
        } while ((ulong)((this->super_CurveGeometryInterface<embree::BezierCurveT>).
                         super_CurveGeometry.super_Geometry.numTimeSteps - 1) * 0x38 + 0x38 !=
                 lVar27);
        pcVar9 = (pBVar5->super_RawBufferView).ptr_ofs;
        sVar10 = (pBVar5->super_RawBufferView).stride;
        fVar57 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                 maxRadiusScale;
        auVar63 = vinsertps_avx(*(undefined1 (*) [16])(pcVar9 + sVar10 * uVar26),
                                ZEXT416((uint)(fVar57 * *(float *)(pcVar9 + sVar10 * uVar26 + 0xc)))
                                ,0x30);
        auVar58 = vinsertps_avx(*(undefined1 (*) [16])(pcVar9 + sVar10 * uVar30),
                                ZEXT416((uint)(fVar57 * *(float *)(pcVar9 + sVar10 * uVar30 + 0xc)))
                                ,0x30);
        auVar12 = vinsertps_avx(*(undefined1 (*) [16])(pcVar9 + sVar10 * uVar31),
                                ZEXT416((uint)(fVar57 * *(float *)(pcVar9 + sVar10 * uVar31 + 0xc)))
                                ,0x30);
        auVar88 = vinsertps_avx(*(undefined1 (*) [16])(pcVar9 + sVar10 * uVar29),
                                ZEXT416((uint)(fVar57 * *(float *)(pcVar9 + sVar10 * uVar29 + 0xc)))
                                ,0x30);
        pBVar6 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                 normals.items;
        pcVar9 = (pBVar6->super_RawBufferView).ptr_ofs;
        sVar10 = (pBVar6->super_RawBufferView).stride;
        pfVar1 = (float *)(pcVar9 + uVar26 * sVar10);
        fVar72 = *pfVar1;
        fVar32 = pfVar1[1];
        fVar53 = pfVar1[2];
        fVar54 = pfVar1[3];
        pfVar1 = (float *)(pcVar9 + uVar30 * sVar10);
        pfVar2 = (float *)(pcVar9 + uVar31 * sVar10);
        pfVar3 = (float *)(pcVar9 + sVar10 * uVar29);
        fVar55 = *pfVar3;
        fVar96 = pfVar3[1];
        fVar116 = pfVar3[2];
        fVar117 = pfVar3[3];
        fVar57 = auVar88._0_4_;
        fVar56 = auVar88._4_4_;
        fVar70 = auVar88._8_4_;
        fVar71 = auVar88._12_4_;
        fVar164 = auVar12._0_4_ * 0.0;
        fVar180 = auVar12._4_4_ * 0.0;
        fVar183 = auVar12._8_4_ * 0.0;
        fVar186 = auVar12._12_4_ * 0.0;
        fVar149 = fVar164 + fVar57 * 0.0;
        fVar150 = fVar180 + fVar56 * 0.0;
        fVar160 = fVar183 + fVar70 * 0.0;
        fVar162 = fVar186 + fVar71 * 0.0;
        fVar173 = auVar58._0_4_ * 0.0;
        fVar181 = auVar58._4_4_ * 0.0;
        fVar187 = auVar58._8_4_ * 0.0;
        fVar192 = auVar58._12_4_ * 0.0;
        fVar118 = auVar63._0_4_;
        fVar136 = fVar118 + fVar173 + fVar149;
        fVar137 = auVar63._4_4_;
        fVar178 = fVar137 + fVar181 + fVar150;
        fVar147 = auVar63._8_4_;
        fVar184 = fVar147 + fVar187 + fVar160;
        fVar148 = auVar63._12_4_;
        fVar190 = fVar148 + fVar192 + fVar162;
        auVar89._0_4_ = auVar58._0_4_ * 3.0 + fVar149;
        auVar89._4_4_ = auVar58._4_4_ * 3.0 + fVar150;
        auVar89._8_4_ = auVar58._8_4_ * 3.0 + fVar160;
        auVar89._12_4_ = auVar58._12_4_ * 3.0 + fVar162;
        auVar124._0_4_ = fVar118 * 3.0;
        auVar124._4_4_ = fVar137 * 3.0;
        auVar124._8_4_ = fVar147 * 3.0;
        auVar124._12_4_ = fVar148 * 3.0;
        auVar39 = vsubps_avx(auVar89,auVar124);
        fVar194 = *pfVar2 * 0.0;
        fVar196 = pfVar2[1] * 0.0;
        fVar201 = pfVar2[2] * 0.0;
        fVar203 = pfVar2[3] * 0.0;
        fVar149 = fVar194 + fVar55 * 0.0;
        fVar150 = fVar196 + fVar96 * 0.0;
        fVar160 = fVar201 + fVar116 * 0.0;
        fVar162 = fVar203 + fVar117 * 0.0;
        fVar205 = *pfVar1 * 0.0;
        fVar211 = pfVar1[1] * 0.0;
        fVar213 = pfVar1[2] * 0.0;
        fVar214 = pfVar1[3] * 0.0;
        auVar216._0_4_ = fVar205 + fVar149 + fVar72;
        auVar216._4_4_ = fVar211 + fVar150 + fVar32;
        auVar216._8_4_ = fVar213 + fVar160 + fVar53;
        auVar216._12_4_ = fVar214 + fVar162 + fVar54;
        auVar125._0_4_ = *pfVar1 * 3.0 + fVar149;
        auVar125._4_4_ = pfVar1[1] * 3.0 + fVar150;
        auVar125._8_4_ = pfVar1[2] * 3.0 + fVar160;
        auVar125._12_4_ = pfVar1[3] * 3.0 + fVar162;
        auVar165._0_4_ = fVar72 * 3.0;
        auVar165._4_4_ = fVar32 * 3.0;
        auVar165._8_4_ = fVar53 * 3.0;
        auVar165._12_4_ = fVar54 * 3.0;
        auVar88 = vsubps_avx(auVar125,auVar165);
        auVar40._0_4_ = fVar118 * 0.0;
        auVar40._4_4_ = fVar137 * 0.0;
        auVar40._8_4_ = fVar147 * 0.0;
        auVar40._12_4_ = fVar148 * 0.0;
        auVar126._0_4_ = auVar40._0_4_ + fVar173 + fVar164 + fVar57;
        auVar126._4_4_ = auVar40._4_4_ + fVar181 + fVar180 + fVar56;
        auVar126._8_4_ = auVar40._8_4_ + fVar187 + fVar183 + fVar70;
        auVar126._12_4_ = auVar40._12_4_ + fVar192 + fVar186 + fVar71;
        auVar135._0_4_ = fVar57 * 3.0;
        auVar135._4_4_ = fVar56 * 3.0;
        auVar135._8_4_ = fVar70 * 3.0;
        auVar135._12_4_ = fVar71 * 3.0;
        auVar78._0_4_ = auVar12._0_4_ * 3.0;
        auVar78._4_4_ = auVar12._4_4_ * 3.0;
        auVar78._8_4_ = auVar12._8_4_ * 3.0;
        auVar78._12_4_ = auVar12._12_4_ * 3.0;
        auVar63 = vsubps_avx(auVar135,auVar78);
        auVar79._0_4_ = fVar173 + auVar63._0_4_;
        auVar79._4_4_ = fVar181 + auVar63._4_4_;
        auVar79._8_4_ = fVar187 + auVar63._8_4_;
        auVar79._12_4_ = fVar192 + auVar63._12_4_;
        auVar38 = vsubps_avx(auVar79,auVar40);
        auVar80._0_4_ = fVar72 * 0.0;
        auVar80._4_4_ = fVar32 * 0.0;
        auVar80._8_4_ = fVar53 * 0.0;
        auVar80._12_4_ = fVar54 * 0.0;
        auVar41._0_4_ = auVar80._0_4_ + fVar205 + fVar194 + fVar55;
        auVar41._4_4_ = auVar80._4_4_ + fVar211 + fVar196 + fVar96;
        auVar41._8_4_ = auVar80._8_4_ + fVar213 + fVar201 + fVar116;
        auVar41._12_4_ = auVar80._12_4_ + fVar214 + fVar203 + fVar117;
        auVar104._0_4_ = fVar55 * 3.0;
        auVar104._4_4_ = fVar96 * 3.0;
        auVar104._8_4_ = fVar116 * 3.0;
        auVar104._12_4_ = fVar117 * 3.0;
        auVar140._0_4_ = *pfVar2 * 3.0;
        auVar140._4_4_ = pfVar2[1] * 3.0;
        auVar140._8_4_ = pfVar2[2] * 3.0;
        auVar140._12_4_ = pfVar2[3] * 3.0;
        auVar63 = vsubps_avx(auVar104,auVar140);
        auVar105._0_4_ = fVar205 + auVar63._0_4_;
        auVar105._4_4_ = fVar211 + auVar63._4_4_;
        auVar105._8_4_ = fVar213 + auVar63._8_4_;
        auVar105._12_4_ = fVar214 + auVar63._12_4_;
        auVar33 = vsubps_avx(auVar105,auVar80);
        auVar63 = vshufps_avx(auVar39,auVar39,0xc9);
        auVar58 = vshufps_avx(auVar216,auVar216,0xc9);
        fVar194 = auVar39._0_4_;
        auVar141._0_4_ = fVar194 * auVar58._0_4_;
        fVar201 = auVar39._4_4_;
        auVar141._4_4_ = fVar201 * auVar58._4_4_;
        fVar205 = auVar39._8_4_;
        auVar141._8_4_ = fVar205 * auVar58._8_4_;
        fVar213 = auVar39._12_4_;
        auVar141._12_4_ = fVar213 * auVar58._12_4_;
        auVar154._0_4_ = auVar216._0_4_ * auVar63._0_4_;
        auVar154._4_4_ = auVar216._4_4_ * auVar63._4_4_;
        auVar154._8_4_ = auVar216._8_4_ * auVar63._8_4_;
        auVar154._12_4_ = auVar216._12_4_ * auVar63._12_4_;
        auVar58 = vsubps_avx(auVar154,auVar141);
        auVar12 = vshufps_avx(auVar58,auVar58,0xc9);
        auVar58 = vshufps_avx(auVar88,auVar88,0xc9);
        auVar155._0_4_ = auVar58._0_4_ * fVar194;
        auVar155._4_4_ = auVar58._4_4_ * fVar201;
        auVar155._8_4_ = auVar58._8_4_ * fVar205;
        auVar155._12_4_ = auVar58._12_4_ * fVar213;
        auVar106._0_4_ = auVar88._0_4_ * auVar63._0_4_;
        auVar106._4_4_ = auVar88._4_4_ * auVar63._4_4_;
        auVar106._8_4_ = auVar88._8_4_ * auVar63._8_4_;
        auVar106._12_4_ = auVar88._12_4_ * auVar63._12_4_;
        auVar63 = vsubps_avx(auVar106,auVar155);
        auVar88 = vshufps_avx(auVar63,auVar63,0xc9);
        auVar63 = vshufps_avx(auVar38,auVar38,0xc9);
        auVar58 = vshufps_avx(auVar41,auVar41,0xc9);
        fVar57 = auVar38._0_4_;
        auVar166._0_4_ = auVar58._0_4_ * fVar57;
        fVar56 = auVar38._4_4_;
        auVar166._4_4_ = auVar58._4_4_ * fVar56;
        fVar70 = auVar38._8_4_;
        auVar166._8_4_ = auVar58._8_4_ * fVar70;
        fVar71 = auVar38._12_4_;
        auVar166._12_4_ = auVar58._12_4_ * fVar71;
        auVar42._0_4_ = auVar63._0_4_ * auVar41._0_4_;
        auVar42._4_4_ = auVar63._4_4_ * auVar41._4_4_;
        auVar42._8_4_ = auVar63._8_4_ * auVar41._8_4_;
        auVar42._12_4_ = auVar63._12_4_ * auVar41._12_4_;
        auVar58 = vsubps_avx(auVar42,auVar166);
        auVar152 = vshufps_avx(auVar58,auVar58,0xc9);
        auVar58 = vshufps_avx(auVar33,auVar33,0xc9);
        auVar167._0_4_ = auVar58._0_4_ * fVar57;
        auVar167._4_4_ = auVar58._4_4_ * fVar56;
        auVar167._8_4_ = auVar58._8_4_ * fVar70;
        auVar167._12_4_ = auVar58._12_4_ * fVar71;
        auVar81._0_4_ = auVar63._0_4_ * auVar33._0_4_;
        auVar81._4_4_ = auVar63._4_4_ * auVar33._4_4_;
        auVar81._8_4_ = auVar63._8_4_ * auVar33._8_4_;
        auVar81._12_4_ = auVar63._12_4_ * auVar33._12_4_;
        auVar58 = vsubps_avx(auVar81,auVar167);
        auVar63 = vdpps_avx(auVar12,auVar12,0x7f);
        auVar33 = vshufps_avx(auVar58,auVar58,0xc9);
        fVar55 = auVar63._0_4_;
        auVar143 = ZEXT416((uint)fVar55);
        auVar58 = vrsqrtss_avx(auVar143,auVar143);
        fVar72 = auVar58._0_4_;
        auVar58 = vdpps_avx(auVar12,auVar88,0x7f);
        auVar61 = ZEXT416((uint)(fVar72 * 1.5 - fVar55 * 0.5 * fVar72 * fVar72 * fVar72));
        auVar61 = vshufps_avx(auVar61,auVar61,0);
        fVar72 = auVar61._0_4_ * auVar12._0_4_;
        fVar32 = auVar61._4_4_ * auVar12._4_4_;
        fVar53 = auVar61._8_4_ * auVar12._8_4_;
        fVar54 = auVar61._12_4_ * auVar12._12_4_;
        auVar63 = vshufps_avx(auVar63,auVar63,0);
        auVar156._0_4_ = auVar63._0_4_ * auVar88._0_4_;
        auVar156._4_4_ = auVar63._4_4_ * auVar88._4_4_;
        auVar156._8_4_ = auVar63._8_4_ * auVar88._8_4_;
        auVar156._12_4_ = auVar63._12_4_ * auVar88._12_4_;
        auVar63 = vshufps_avx(auVar58,auVar58,0);
        auVar142._0_4_ = auVar63._0_4_ * auVar12._0_4_;
        auVar142._4_4_ = auVar63._4_4_ * auVar12._4_4_;
        auVar142._8_4_ = auVar63._8_4_ * auVar12._8_4_;
        auVar142._12_4_ = auVar63._12_4_ * auVar12._12_4_;
        auVar34 = vsubps_avx(auVar156,auVar142);
        auVar58 = vrcpss_avx(auVar143,auVar143);
        auVar63 = vdpps_avx(auVar152,auVar152,0x7f);
        auVar58 = ZEXT416((uint)(auVar58._0_4_ * (2.0 - fVar55 * auVar58._0_4_)));
        auVar12 = vshufps_avx(auVar58,auVar58,0);
        fVar55 = auVar63._0_4_;
        auVar143 = ZEXT416((uint)fVar55);
        auVar58 = vrsqrtss_avx(auVar143,auVar143);
        fVar96 = auVar58._0_4_;
        auVar58 = ZEXT416((uint)(fVar96 * 1.5 - fVar55 * 0.5 * fVar96 * fVar96 * fVar96));
        auVar88 = vshufps_avx(auVar58,auVar58,0);
        auVar58 = vdpps_avx(auVar152,auVar33,0x7f);
        fVar96 = auVar88._0_4_ * auVar152._0_4_;
        fVar116 = auVar88._4_4_ * auVar152._4_4_;
        fVar117 = auVar88._8_4_ * auVar152._8_4_;
        fVar118 = auVar88._12_4_ * auVar152._12_4_;
        auVar63 = vshufps_avx(auVar63,auVar63,0);
        auVar107._0_4_ = auVar63._0_4_ * auVar33._0_4_;
        auVar107._4_4_ = auVar63._4_4_ * auVar33._4_4_;
        auVar107._8_4_ = auVar63._8_4_ * auVar33._8_4_;
        auVar107._12_4_ = auVar63._12_4_ * auVar33._12_4_;
        auVar63 = vshufps_avx(auVar58,auVar58,0);
        auVar43._0_4_ = auVar63._0_4_ * auVar152._0_4_;
        auVar43._4_4_ = auVar63._4_4_ * auVar152._4_4_;
        auVar43._8_4_ = auVar63._8_4_ * auVar152._8_4_;
        auVar43._12_4_ = auVar63._12_4_ * auVar152._12_4_;
        auVar33 = vsubps_avx(auVar107,auVar43);
        auVar63 = vrcpss_avx(auVar143,auVar143);
        auVar63 = ZEXT416((uint)(auVar63._0_4_ * (2.0 - fVar55 * auVar63._0_4_)));
        auVar63 = vshufps_avx(auVar63,auVar63,0);
        auVar22._4_4_ = fVar178;
        auVar22._0_4_ = fVar136;
        auVar22._8_4_ = fVar184;
        auVar22._12_4_ = fVar190;
        auVar58 = vshufps_avx(auVar22,auVar22,0xff);
        auVar168._0_4_ = auVar58._0_4_ * fVar72;
        auVar168._4_4_ = auVar58._4_4_ * fVar32;
        auVar168._8_4_ = auVar58._8_4_ * fVar53;
        auVar168._12_4_ = auVar58._12_4_ * fVar54;
        auVar143 = vsubps_avx(auVar22,auVar168);
        auVar152 = vshufps_avx(auVar39,auVar39,0xff);
        auVar108._0_4_ =
             auVar152._0_4_ * fVar72 + auVar61._0_4_ * auVar12._0_4_ * auVar34._0_4_ * auVar58._0_4_
        ;
        auVar108._4_4_ =
             auVar152._4_4_ * fVar32 + auVar61._4_4_ * auVar12._4_4_ * auVar34._4_4_ * auVar58._4_4_
        ;
        auVar108._8_4_ =
             auVar152._8_4_ * fVar53 + auVar61._8_4_ * auVar12._8_4_ * auVar34._8_4_ * auVar58._8_4_
        ;
        auVar108._12_4_ =
             auVar152._12_4_ * fVar54 +
             auVar61._12_4_ * auVar12._12_4_ * auVar34._12_4_ * auVar58._12_4_;
        auVar152 = vsubps_avx(auVar39,auVar108);
        fVar136 = auVar168._0_4_ + fVar136;
        fVar178 = auVar168._4_4_ + fVar178;
        fVar184 = auVar168._8_4_ + fVar184;
        fVar190 = auVar168._12_4_ + fVar190;
        auVar58 = vshufps_avx(auVar126,auVar126,0xff);
        auVar90._0_4_ = fVar96 * auVar58._0_4_;
        auVar90._4_4_ = fVar116 * auVar58._4_4_;
        auVar90._8_4_ = fVar117 * auVar58._8_4_;
        auVar90._12_4_ = fVar118 * auVar58._12_4_;
        auVar61 = vsubps_avx(auVar126,auVar90);
        auVar12 = vshufps_avx(auVar38,auVar38,0xff);
        auVar44._0_4_ =
             fVar96 * auVar12._0_4_ + auVar58._0_4_ * auVar88._0_4_ * auVar33._0_4_ * auVar63._0_4_;
        auVar44._4_4_ =
             fVar116 * auVar12._4_4_ + auVar58._4_4_ * auVar88._4_4_ * auVar33._4_4_ * auVar63._4_4_
        ;
        auVar44._8_4_ =
             fVar117 * auVar12._8_4_ + auVar58._8_4_ * auVar88._8_4_ * auVar33._8_4_ * auVar63._8_4_
        ;
        auVar44._12_4_ =
             fVar118 * auVar12._12_4_ +
             auVar58._12_4_ * auVar88._12_4_ * auVar33._12_4_ * auVar63._12_4_;
        auVar63 = vsubps_avx(auVar38,auVar44);
        auVar45._0_4_ = auVar63._0_4_ * 0.33333334;
        auVar45._4_4_ = auVar63._4_4_ * 0.33333334;
        auVar45._8_4_ = auVar63._8_4_ * 0.33333334;
        auVar45._12_4_ = auVar63._12_4_ * 0.33333334;
        auVar33 = vsubps_avx(auVar61,auVar45);
        auVar63 = vshufps_avx(auVar33,auVar33,0);
        auVar58 = vshufps_avx(auVar33,auVar33,0x55);
        auVar12 = vshufps_avx(auVar61,auVar61,0);
        auVar88 = vshufps_avx(auVar61,auVar61,0x55);
        fVar188 = auVar12._0_4_;
        fVar191 = auVar12._4_4_;
        fVar193 = auVar12._8_4_;
        fVar195 = auVar12._12_4_;
        fVar173 = auVar63._0_4_;
        fVar181 = auVar63._4_4_;
        fVar187 = auVar63._8_4_;
        fVar192 = auVar63._12_4_;
        fVar174 = auVar88._0_4_;
        fVar179 = auVar88._4_4_;
        fVar182 = auVar88._8_4_;
        fVar185 = auVar88._12_4_;
        fVar196 = auVar58._0_4_;
        fVar203 = auVar58._4_4_;
        fVar211 = auVar58._8_4_;
        fVar214 = auVar58._12_4_;
        auVar63 = vshufps_avx(auVar33,auVar33,0xaa);
        auVar58 = vshufps_avx(auVar61,auVar61,0xaa);
        fVar197 = auVar58._0_4_;
        fVar202 = auVar58._4_4_;
        fVar204 = auVar58._8_4_;
        fVar206 = auVar58._12_4_;
        fVar210 = auVar63._0_4_;
        fVar212 = auVar63._4_4_;
        fVar215 = auVar63._8_4_;
        auVar127._0_4_ = auVar143._0_4_ + auVar152._0_4_ * 0.33333334;
        auVar127._4_4_ = auVar143._4_4_ + auVar152._4_4_ * 0.33333334;
        auVar127._8_4_ = auVar143._8_4_ + auVar152._8_4_ * 0.33333334;
        auVar127._12_4_ = auVar143._12_4_ + auVar152._12_4_ * 0.33333334;
        auVar58 = vshufps_avx(auVar127,auVar127,0);
        fVar72 = auVar58._0_4_;
        fVar96 = auVar58._4_4_;
        fVar147 = auVar58._8_4_;
        fVar162 = auVar58._12_4_;
        auVar58 = vshufps_avx(auVar127,auVar127,0x55);
        fVar32 = auVar58._0_4_;
        fVar116 = auVar58._4_4_;
        fVar148 = auVar58._8_4_;
        fVar164 = auVar58._12_4_;
        auVar58 = vshufps_avx(auVar127,auVar127,0xaa);
        fVar53 = auVar58._0_4_;
        fVar117 = auVar58._4_4_;
        fVar149 = auVar58._8_4_;
        fVar180 = auVar58._12_4_;
        auVar58 = vshufps_avx(auVar143,auVar143,0);
        fVar54 = auVar58._0_4_;
        fVar118 = auVar58._4_4_;
        fVar150 = auVar58._8_4_;
        fVar183 = auVar58._12_4_;
        auVar222._0_4_ =
             (float)bezier_basis0._476_4_ * fVar54 +
             (float)bezier_basis0._1632_4_ * fVar72 +
             fVar173 * (float)bezier_basis0._2788_4_ + fVar188 * (float)bezier_basis0._3944_4_;
        auVar222._4_4_ =
             (float)bezier_basis0._480_4_ * fVar118 +
             (float)bezier_basis0._1636_4_ * fVar96 +
             fVar181 * (float)bezier_basis0._2792_4_ + fVar191 * (float)bezier_basis0._3948_4_;
        auVar222._8_4_ =
             (float)bezier_basis0._484_4_ * fVar150 +
             (float)bezier_basis0._1640_4_ * fVar147 +
             fVar187 * (float)bezier_basis0._2796_4_ + fVar193 * (float)bezier_basis0._3952_4_;
        auVar222._12_4_ =
             (float)bezier_basis0._488_4_ * fVar183 +
             (float)bezier_basis0._1644_4_ * fVar162 +
             fVar192 * (float)bezier_basis0._2800_4_ + fVar195 * (float)bezier_basis0._3956_4_;
        auVar222._16_4_ =
             (float)bezier_basis0._492_4_ * fVar54 +
             (float)bezier_basis0._1648_4_ * fVar72 +
             fVar173 * (float)bezier_basis0._2804_4_ + fVar188 * (float)bezier_basis0._3960_4_;
        auVar222._20_4_ =
             (float)bezier_basis0._496_4_ * fVar118 +
             (float)bezier_basis0._1652_4_ * fVar96 +
             fVar181 * (float)bezier_basis0._2808_4_ + fVar191 * (float)bezier_basis0._3964_4_;
        auVar222._24_4_ =
             (float)bezier_basis0._500_4_ * fVar150 +
             (float)bezier_basis0._1656_4_ * fVar147 +
             fVar187 * (float)bezier_basis0._2812_4_ + fVar193 * (float)bezier_basis0._3968_4_;
        auVar222._28_4_ = (float)bezier_basis0._3972_4_ + 0.0 + fVar192 + 0.0 + 0.0;
        auVar58 = vshufps_avx(auVar143,auVar143,0x55);
        fVar55 = auVar58._0_4_;
        fVar137 = auVar58._4_4_;
        fVar160 = auVar58._8_4_;
        auVar171._0_4_ =
             (float)bezier_basis0._476_4_ * fVar55 +
             (float)bezier_basis0._1632_4_ * fVar32 +
             fVar196 * (float)bezier_basis0._2788_4_ + fVar174 * (float)bezier_basis0._3944_4_;
        auVar171._4_4_ =
             (float)bezier_basis0._480_4_ * fVar137 +
             (float)bezier_basis0._1636_4_ * fVar116 +
             fVar203 * (float)bezier_basis0._2792_4_ + fVar179 * (float)bezier_basis0._3948_4_;
        auVar171._8_4_ =
             (float)bezier_basis0._484_4_ * fVar160 +
             (float)bezier_basis0._1640_4_ * fVar148 +
             fVar211 * (float)bezier_basis0._2796_4_ + fVar182 * (float)bezier_basis0._3952_4_;
        auVar171._12_4_ =
             (float)bezier_basis0._488_4_ * auVar58._12_4_ +
             (float)bezier_basis0._1644_4_ * fVar164 +
             fVar214 * (float)bezier_basis0._2800_4_ + fVar185 * (float)bezier_basis0._3956_4_;
        auVar171._16_4_ =
             (float)bezier_basis0._492_4_ * fVar55 +
             (float)bezier_basis0._1648_4_ * fVar32 +
             fVar196 * (float)bezier_basis0._2804_4_ + fVar174 * (float)bezier_basis0._3960_4_;
        auVar171._20_4_ =
             (float)bezier_basis0._496_4_ * fVar137 +
             (float)bezier_basis0._1652_4_ * fVar116 +
             fVar203 * (float)bezier_basis0._2808_4_ + fVar179 * (float)bezier_basis0._3964_4_;
        auVar171._24_4_ =
             (float)bezier_basis0._500_4_ * fVar160 +
             (float)bezier_basis0._1656_4_ * fVar148 +
             fVar211 * (float)bezier_basis0._2812_4_ + fVar182 * (float)bezier_basis0._3968_4_;
        auVar171._28_4_ = (float)bezier_basis0._504_4_ + fVar214 + fVar192 + 0.0;
        auVar12 = vshufps_avx(auVar143,auVar143,0xaa);
        fVar151 = auVar12._0_4_;
        fVar161 = auVar12._4_4_;
        fVar163 = auVar12._8_4_;
        auVar145._0_4_ =
             (float)bezier_basis0._1632_4_ * fVar53 +
             fVar210 * (float)bezier_basis0._2788_4_ + fVar197 * (float)bezier_basis0._3944_4_ +
             fVar151 * (float)bezier_basis0._476_4_;
        auVar145._4_4_ =
             (float)bezier_basis0._1636_4_ * fVar117 +
             fVar212 * (float)bezier_basis0._2792_4_ + fVar202 * (float)bezier_basis0._3948_4_ +
             fVar161 * (float)bezier_basis0._480_4_;
        auVar145._8_4_ =
             (float)bezier_basis0._1640_4_ * fVar149 +
             fVar215 * (float)bezier_basis0._2796_4_ + fVar204 * (float)bezier_basis0._3952_4_ +
             fVar163 * (float)bezier_basis0._484_4_;
        auVar145._12_4_ =
             (float)bezier_basis0._1644_4_ * fVar180 +
             auVar63._12_4_ * (float)bezier_basis0._2800_4_ +
             fVar206 * (float)bezier_basis0._3956_4_ + auVar12._12_4_ * (float)bezier_basis0._488_4_
        ;
        auVar145._16_4_ =
             (float)bezier_basis0._1648_4_ * fVar53 +
             fVar210 * (float)bezier_basis0._2804_4_ + fVar197 * (float)bezier_basis0._3960_4_ +
             fVar151 * (float)bezier_basis0._492_4_;
        auVar145._20_4_ =
             (float)bezier_basis0._1652_4_ * fVar117 +
             fVar212 * (float)bezier_basis0._2808_4_ + fVar202 * (float)bezier_basis0._3964_4_ +
             fVar161 * (float)bezier_basis0._496_4_;
        auVar145._24_4_ =
             (float)bezier_basis0._1656_4_ * fVar149 +
             fVar215 * (float)bezier_basis0._2812_4_ + fVar204 * (float)bezier_basis0._3968_4_ +
             fVar163 * (float)bezier_basis0._500_4_;
        auVar145._28_4_ = (float)bezier_basis0._3972_4_ + 0.0 + 0.0 + 0.0;
        fVar186 = fVar162 + fVar195 + 0.0;
        auVar85._0_4_ =
             fVar54 * (float)bezier_basis0._5100_4_ +
             (float)bezier_basis0._6256_4_ * fVar72 +
             (float)bezier_basis0._7412_4_ * fVar173 + fVar188 * (float)bezier_basis0._8568_4_;
        auVar85._4_4_ =
             fVar118 * (float)bezier_basis0._5104_4_ +
             (float)bezier_basis0._6260_4_ * fVar96 +
             (float)bezier_basis0._7416_4_ * fVar181 + fVar191 * (float)bezier_basis0._8572_4_;
        auVar85._8_4_ =
             fVar150 * (float)bezier_basis0._5108_4_ +
             (float)bezier_basis0._6264_4_ * fVar147 +
             (float)bezier_basis0._7420_4_ * fVar187 + fVar193 * (float)bezier_basis0._8576_4_;
        auVar85._12_4_ =
             fVar183 * (float)bezier_basis0._5112_4_ +
             (float)bezier_basis0._6268_4_ * fVar162 +
             (float)bezier_basis0._7424_4_ * fVar192 + fVar195 * (float)bezier_basis0._8580_4_;
        auVar85._16_4_ =
             fVar54 * (float)bezier_basis0._5116_4_ +
             (float)bezier_basis0._6272_4_ * fVar72 +
             (float)bezier_basis0._7428_4_ * fVar173 + fVar188 * (float)bezier_basis0._8584_4_;
        auVar85._20_4_ =
             fVar118 * (float)bezier_basis0._5120_4_ +
             (float)bezier_basis0._6276_4_ * fVar96 +
             (float)bezier_basis0._7432_4_ * fVar181 + fVar191 * (float)bezier_basis0._8588_4_;
        auVar85._24_4_ =
             fVar150 * (float)bezier_basis0._5124_4_ +
             (float)bezier_basis0._6280_4_ * fVar147 +
             (float)bezier_basis0._7436_4_ * fVar187 + fVar193 * (float)bezier_basis0._8592_4_;
        auVar85._28_4_ = fVar183 + fVar186;
        auVar112._0_4_ =
             fVar55 * (float)bezier_basis0._5100_4_ +
             (float)bezier_basis0._7412_4_ * fVar196 + fVar174 * (float)bezier_basis0._8568_4_ +
             (float)bezier_basis0._6256_4_ * fVar32;
        auVar112._4_4_ =
             fVar137 * (float)bezier_basis0._5104_4_ +
             (float)bezier_basis0._7416_4_ * fVar203 + fVar179 * (float)bezier_basis0._8572_4_ +
             (float)bezier_basis0._6260_4_ * fVar116;
        auVar112._8_4_ =
             fVar160 * (float)bezier_basis0._5108_4_ +
             (float)bezier_basis0._7420_4_ * fVar211 + fVar182 * (float)bezier_basis0._8576_4_ +
             (float)bezier_basis0._6264_4_ * fVar148;
        auVar112._12_4_ =
             auVar58._12_4_ * (float)bezier_basis0._5112_4_ +
             (float)bezier_basis0._7424_4_ * fVar214 + fVar185 * (float)bezier_basis0._8580_4_ +
             (float)bezier_basis0._6268_4_ * fVar164;
        auVar112._16_4_ =
             fVar55 * (float)bezier_basis0._5116_4_ +
             (float)bezier_basis0._7428_4_ * fVar196 + fVar174 * (float)bezier_basis0._8584_4_ +
             (float)bezier_basis0._6272_4_ * fVar32;
        auVar112._20_4_ =
             fVar137 * (float)bezier_basis0._5120_4_ +
             (float)bezier_basis0._7432_4_ * fVar203 + fVar179 * (float)bezier_basis0._8588_4_ +
             (float)bezier_basis0._6276_4_ * fVar116;
        auVar112._24_4_ =
             fVar160 * (float)bezier_basis0._5124_4_ +
             (float)bezier_basis0._7436_4_ * fVar211 + fVar182 * (float)bezier_basis0._8592_4_ +
             (float)bezier_basis0._6280_4_ * fVar148;
        auVar112._28_4_ = fVar186 + fVar195 + fVar185 + fVar164;
        auVar67._0_4_ =
             fVar151 * (float)bezier_basis0._5100_4_ +
             fVar210 * (float)bezier_basis0._7412_4_ + fVar197 * (float)bezier_basis0._8568_4_ +
             (float)bezier_basis0._6256_4_ * fVar53;
        auVar67._4_4_ =
             fVar161 * (float)bezier_basis0._5104_4_ +
             fVar212 * (float)bezier_basis0._7416_4_ + fVar202 * (float)bezier_basis0._8572_4_ +
             (float)bezier_basis0._6260_4_ * fVar117;
        auVar67._8_4_ =
             fVar163 * (float)bezier_basis0._5108_4_ +
             fVar215 * (float)bezier_basis0._7420_4_ + fVar204 * (float)bezier_basis0._8576_4_ +
             (float)bezier_basis0._6264_4_ * fVar149;
        auVar67._12_4_ =
             auVar12._12_4_ * (float)bezier_basis0._5112_4_ +
             auVar63._12_4_ * (float)bezier_basis0._7424_4_ +
             fVar206 * (float)bezier_basis0._8580_4_ + (float)bezier_basis0._6268_4_ * fVar180;
        auVar67._16_4_ =
             fVar151 * (float)bezier_basis0._5116_4_ +
             fVar210 * (float)bezier_basis0._7428_4_ + fVar197 * (float)bezier_basis0._8584_4_ +
             (float)bezier_basis0._6272_4_ * fVar53;
        auVar67._20_4_ =
             fVar161 * (float)bezier_basis0._5120_4_ +
             fVar212 * (float)bezier_basis0._7432_4_ + fVar202 * (float)bezier_basis0._8588_4_ +
             (float)bezier_basis0._6276_4_ * fVar117;
        auVar67._24_4_ =
             fVar163 * (float)bezier_basis0._5124_4_ +
             fVar215 * (float)bezier_basis0._7436_4_ + fVar204 * (float)bezier_basis0._8592_4_ +
             (float)bezier_basis0._6280_4_ * fVar149;
        auVar67._28_4_ = fVar186 + fVar206 + fVar195 + fVar180;
        auVar11 = vblendps_avx(auVar85,ZEXT832(0) << 0x20,1);
        auVar16._4_4_ = auVar11._4_4_ * 0.055555556;
        auVar16._0_4_ = auVar11._0_4_ * 0.055555556;
        auVar16._8_4_ = auVar11._8_4_ * 0.055555556;
        auVar16._12_4_ = auVar11._12_4_ * 0.055555556;
        auVar16._16_4_ = auVar11._16_4_ * 0.055555556;
        auVar16._20_4_ = auVar11._20_4_ * 0.055555556;
        auVar16._24_4_ = auVar11._24_4_ * 0.055555556;
        auVar16._28_4_ = auVar11._28_4_;
        auVar177 = vsubps_avx(auVar222,auVar16);
        auVar11 = vblendps_avx(auVar85,ZEXT832(0) << 0x20,0x80);
        auVar86._0_4_ = auVar222._0_4_ + auVar11._0_4_ * 0.055555556;
        auVar86._4_4_ = auVar222._4_4_ + auVar11._4_4_ * 0.055555556;
        auVar86._8_4_ = auVar222._8_4_ + auVar11._8_4_ * 0.055555556;
        auVar86._12_4_ = auVar222._12_4_ + auVar11._12_4_ * 0.055555556;
        auVar86._16_4_ = auVar222._16_4_ + auVar11._16_4_ * 0.055555556;
        auVar86._20_4_ = auVar222._20_4_ + auVar11._20_4_ * 0.055555556;
        auVar86._24_4_ = auVar222._24_4_ + auVar11._24_4_ * 0.055555556;
        auVar86._28_4_ = auVar222._28_4_ + auVar11._28_4_;
        auVar130._8_4_ = 0x7f800000;
        auVar130._0_8_ = 0x7f8000007f800000;
        auVar130._12_4_ = 0x7f800000;
        auVar130._16_4_ = 0x7f800000;
        auVar130._20_4_ = 0x7f800000;
        auVar130._24_4_ = 0x7f800000;
        auVar130._28_4_ = 0x7f800000;
        auVar11 = vminps_avx(auVar130,auVar222);
        auVar172 = vminps_avx(auVar177,auVar86);
        auVar176 = vminps_avx(auVar11,auVar172);
        auVar198 = ZEXT832(0) << 0x20;
        auVar11 = vblendps_avx(auVar112,auVar198,1);
        auVar17._4_4_ = auVar11._4_4_ * 0.055555556;
        auVar17._0_4_ = auVar11._0_4_ * 0.055555556;
        auVar17._8_4_ = auVar11._8_4_ * 0.055555556;
        auVar17._12_4_ = auVar11._12_4_ * 0.055555556;
        auVar17._16_4_ = auVar11._16_4_ * 0.055555556;
        auVar17._20_4_ = auVar11._20_4_ * 0.055555556;
        auVar17._24_4_ = auVar11._24_4_ * 0.055555556;
        auVar17._28_4_ = auVar11._28_4_;
        auVar170 = vsubps_avx(auVar171,auVar17);
        auVar11 = vblendps_avx(auVar112,auVar198,0x80);
        auVar113._0_4_ = auVar171._0_4_ + auVar11._0_4_ * 0.055555556;
        auVar113._4_4_ = auVar171._4_4_ + auVar11._4_4_ * 0.055555556;
        auVar113._8_4_ = auVar171._8_4_ + auVar11._8_4_ * 0.055555556;
        auVar113._12_4_ = auVar171._12_4_ + auVar11._12_4_ * 0.055555556;
        auVar113._16_4_ = auVar171._16_4_ + auVar11._16_4_ * 0.055555556;
        auVar113._20_4_ = auVar171._20_4_ + auVar11._20_4_ * 0.055555556;
        auVar113._24_4_ = auVar171._24_4_ + auVar11._24_4_ * 0.055555556;
        auVar113._28_4_ = auVar171._28_4_ + auVar11._28_4_;
        auVar11 = vminps_avx(auVar130,auVar171);
        auVar172 = vminps_avx(auVar170,auVar113);
        auVar15 = vminps_avx(auVar11,auVar172);
        auVar11 = vblendps_avx(auVar67,auVar198,1);
        auVar18._4_4_ = auVar11._4_4_ * 0.055555556;
        auVar18._0_4_ = auVar11._0_4_ * 0.055555556;
        auVar18._8_4_ = auVar11._8_4_ * 0.055555556;
        auVar18._12_4_ = auVar11._12_4_ * 0.055555556;
        auVar18._16_4_ = auVar11._16_4_ * 0.055555556;
        auVar18._20_4_ = auVar11._20_4_ * 0.055555556;
        auVar18._24_4_ = auVar11._24_4_ * 0.055555556;
        auVar18._28_4_ = auVar11._28_4_;
        auVar93 = vsubps_avx(auVar145,auVar18);
        auVar11 = vblendps_avx(auVar67,auVar198,0x80);
        auVar199._0_4_ = auVar145._0_4_ + auVar11._0_4_ * 0.055555556;
        auVar199._4_4_ = auVar145._4_4_ + auVar11._4_4_ * 0.055555556;
        auVar199._8_4_ = auVar145._8_4_ + auVar11._8_4_ * 0.055555556;
        auVar199._12_4_ = auVar145._12_4_ + auVar11._12_4_ * 0.055555556;
        auVar199._16_4_ = auVar145._16_4_ + auVar11._16_4_ * 0.055555556;
        auVar199._20_4_ = auVar145._20_4_ + auVar11._20_4_ * 0.055555556;
        auVar199._24_4_ = auVar145._24_4_ + auVar11._24_4_ * 0.055555556;
        auVar199._28_4_ = auVar145._28_4_ + auVar11._28_4_;
        auVar11 = vminps_avx(auVar130,auVar145);
        auVar172 = vminps_avx(auVar93,auVar199);
        auVar198 = vminps_avx(auVar11,auVar172);
        auVar11 = vmaxps_avx(auVar177,auVar86);
        auVar94._8_4_ = 0xff800000;
        auVar94._0_8_ = 0xff800000ff800000;
        auVar94._12_4_ = 0xff800000;
        auVar94._16_4_ = 0xff800000;
        auVar94._20_4_ = 0xff800000;
        auVar94._24_4_ = 0xff800000;
        auVar94._28_4_ = 0xff800000;
        auVar172 = vmaxps_avx(auVar94,auVar222);
        auVar11 = vmaxps_avx(auVar172,auVar11);
        auVar172 = vmaxps_avx(auVar170,auVar113);
        auVar177 = vmaxps_avx(auVar94,auVar171);
        auVar172 = vmaxps_avx(auVar177,auVar172);
        auVar177 = vmaxps_avx(auVar93,auVar199);
        auVar170 = vmaxps_avx(auVar94,auVar145);
        auVar177 = vmaxps_avx(auVar170,auVar177);
        auVar170 = vshufps_avx(auVar176,auVar176,0xb1);
        auVar170 = vminps_avx(auVar176,auVar170);
        auVar176 = vshufpd_avx(auVar170,auVar170,5);
        auVar170 = vminps_avx(auVar170,auVar176);
        auVar63 = vminps_avx(auVar170._0_16_,auVar170._16_16_);
        auVar170 = vshufps_avx(auVar15,auVar15,0xb1);
        auVar170 = vminps_avx(auVar15,auVar170);
        auVar176 = vshufpd_avx(auVar170,auVar170,5);
        auVar170 = vminps_avx(auVar170,auVar176);
        auVar58 = vminps_avx(auVar170._0_16_,auVar170._16_16_);
        auVar58 = vunpcklps_avx(auVar63,auVar58);
        auVar170 = vshufps_avx(auVar198,auVar198,0xb1);
        auVar170 = vminps_avx(auVar198,auVar170);
        auVar176 = vshufpd_avx(auVar170,auVar170,5);
        auVar170 = vminps_avx(auVar170,auVar176);
        auVar63 = vminps_avx(auVar170._0_16_,auVar170._16_16_);
        auVar63 = vinsertps_avx(auVar58,auVar63,0x28);
        auVar170 = vshufps_avx(auVar11,auVar11,0xb1);
        auVar11 = vmaxps_avx(auVar11,auVar170);
        auVar170 = vshufpd_avx(auVar11,auVar11,5);
        auVar11 = vmaxps_avx(auVar11,auVar170);
        auVar58 = vmaxps_avx(auVar11._0_16_,auVar11._16_16_);
        auVar11 = vshufps_avx(auVar172,auVar172,0xb1);
        auVar11 = vmaxps_avx(auVar172,auVar11);
        auVar172 = vshufpd_avx(auVar11,auVar11,5);
        auVar11 = vmaxps_avx(auVar11,auVar172);
        auVar12 = vmaxps_avx(auVar11._0_16_,auVar11._16_16_);
        auVar82._0_4_ = (fVar57 + auVar44._0_4_) * 0.33333334;
        auVar82._4_4_ = (fVar56 + auVar44._4_4_) * 0.33333334;
        auVar82._8_4_ = (fVar70 + auVar44._8_4_) * 0.33333334;
        auVar82._12_4_ = (fVar71 + auVar44._12_4_) * 0.33333334;
        auVar24._4_4_ = auVar126._4_4_ + auVar90._4_4_;
        auVar24._0_4_ = auVar126._0_4_ + auVar90._0_4_;
        auVar24._8_4_ = auVar126._8_4_ + auVar90._8_4_;
        auVar24._12_4_ = auVar126._12_4_ + auVar90._12_4_;
        auVar152 = vsubps_avx(auVar24,auVar82);
        auVar12 = vunpcklps_avx(auVar58,auVar12);
        auVar11 = vshufps_avx(auVar177,auVar177,0xb1);
        auVar11 = vmaxps_avx(auVar177,auVar11);
        auVar172 = vshufpd_avx(auVar11,auVar11,5);
        auVar11 = vmaxps_avx(auVar11,auVar172);
        auVar58 = vmaxps_avx(auVar11._0_16_,auVar11._16_16_);
        auVar58 = vinsertps_avx(auVar12,auVar58,0x28);
        auVar12 = vshufps_avx(auVar152,auVar152,0);
        auVar88 = vshufps_avx(auVar24,auVar24,0);
        fVar162 = auVar88._0_4_;
        fVar164 = auVar88._4_4_;
        fVar180 = auVar88._8_4_;
        fVar183 = auVar88._12_4_;
        fVar161 = auVar12._0_4_;
        fVar163 = auVar12._4_4_;
        fVar174 = auVar12._8_4_;
        fVar179 = auVar12._12_4_;
        auVar12 = vshufps_avx(auVar152,auVar152,0x55);
        auVar88 = vshufps_avx(auVar24,auVar24,0x55);
        fVar117 = auVar88._0_4_;
        fVar118 = auVar88._4_4_;
        fVar137 = auVar88._8_4_;
        fVar147 = auVar88._12_4_;
        fVar181 = auVar12._0_4_;
        fVar187 = auVar12._4_4_;
        fVar192 = auVar12._8_4_;
        fVar196 = auVar12._12_4_;
        auVar12 = vshufps_avx(auVar152,auVar152,0xaa);
        auVar88 = vshufps_avx(auVar24,auVar24,0xaa);
        fVar148 = auVar88._0_4_;
        fVar149 = auVar88._4_4_;
        fVar150 = auVar88._8_4_;
        fVar160 = auVar88._12_4_;
        fVar203 = auVar12._0_4_;
        fVar211 = auVar12._4_4_;
        fVar214 = auVar12._8_4_;
        fVar151 = auVar12._12_4_;
        auVar23._4_4_ = fVar178;
        auVar23._0_4_ = fVar136;
        auVar23._8_4_ = fVar184;
        auVar23._12_4_ = fVar190;
        auVar157._0_4_ = fVar136 + (fVar194 + auVar108._0_4_) * 0.33333334;
        auVar157._4_4_ = fVar178 + (fVar201 + auVar108._4_4_) * 0.33333334;
        auVar157._8_4_ = fVar184 + (fVar205 + auVar108._8_4_) * 0.33333334;
        auVar157._12_4_ = fVar190 + (fVar213 + auVar108._12_4_) * 0.33333334;
        auVar12 = vshufps_avx(auVar157,auVar157,0);
        fVar184 = auVar12._0_4_;
        fVar190 = auVar12._4_4_;
        fVar194 = auVar12._8_4_;
        auVar88 = vshufps_avx(auVar157,auVar157,0x55);
        fVar201 = auVar88._0_4_;
        fVar205 = auVar88._4_4_;
        fVar213 = auVar88._8_4_;
        auVar152 = vshufps_avx(auVar157,auVar157,0xaa);
        fVar186 = auVar152._0_4_;
        fVar136 = auVar152._4_4_;
        fVar173 = auVar152._8_4_;
        fVar178 = auVar152._12_4_;
        auVar152 = vshufps_avx(auVar23,auVar23,0);
        fVar57 = auVar152._0_4_;
        fVar56 = auVar152._4_4_;
        fVar70 = auVar152._8_4_;
        fVar71 = auVar152._12_4_;
        auVar217._0_4_ =
             fVar57 * (float)bezier_basis0._476_4_ +
             fVar184 * (float)bezier_basis0._1632_4_ +
             fVar161 * (float)bezier_basis0._2788_4_ + fVar162 * (float)bezier_basis0._3944_4_;
        auVar217._4_4_ =
             fVar56 * (float)bezier_basis0._480_4_ +
             fVar190 * (float)bezier_basis0._1636_4_ +
             fVar163 * (float)bezier_basis0._2792_4_ + fVar164 * (float)bezier_basis0._3948_4_;
        auVar217._8_4_ =
             fVar70 * (float)bezier_basis0._484_4_ +
             fVar194 * (float)bezier_basis0._1640_4_ +
             fVar174 * (float)bezier_basis0._2796_4_ + fVar180 * (float)bezier_basis0._3952_4_;
        auVar217._12_4_ =
             fVar71 * (float)bezier_basis0._488_4_ +
             auVar12._12_4_ * (float)bezier_basis0._1644_4_ +
             fVar179 * (float)bezier_basis0._2800_4_ + fVar183 * (float)bezier_basis0._3956_4_;
        auVar217._16_4_ =
             fVar57 * (float)bezier_basis0._492_4_ +
             fVar184 * (float)bezier_basis0._1648_4_ +
             fVar161 * (float)bezier_basis0._2804_4_ + fVar162 * (float)bezier_basis0._3960_4_;
        auVar217._20_4_ =
             fVar56 * (float)bezier_basis0._496_4_ +
             fVar190 * (float)bezier_basis0._1652_4_ +
             fVar163 * (float)bezier_basis0._2808_4_ + fVar164 * (float)bezier_basis0._3964_4_;
        auVar217._24_4_ =
             fVar70 * (float)bezier_basis0._500_4_ +
             fVar194 * (float)bezier_basis0._1656_4_ +
             fVar174 * (float)bezier_basis0._2812_4_ + fVar180 * (float)bezier_basis0._3968_4_;
        auVar217._28_4_ = fVar151 + 0.0 + 0.0;
        auVar152 = vshufps_avx(auVar23,auVar23,0x55);
        fVar72 = auVar152._0_4_;
        fVar32 = auVar152._4_4_;
        fVar53 = auVar152._8_4_;
        auVar95._0_4_ =
             fVar72 * (float)bezier_basis0._476_4_ +
             fVar201 * (float)bezier_basis0._1632_4_ +
             fVar181 * (float)bezier_basis0._2788_4_ + fVar117 * (float)bezier_basis0._3944_4_;
        auVar95._4_4_ =
             fVar32 * (float)bezier_basis0._480_4_ +
             fVar205 * (float)bezier_basis0._1636_4_ +
             fVar187 * (float)bezier_basis0._2792_4_ + fVar118 * (float)bezier_basis0._3948_4_;
        auVar95._8_4_ =
             fVar53 * (float)bezier_basis0._484_4_ +
             fVar213 * (float)bezier_basis0._1640_4_ +
             fVar192 * (float)bezier_basis0._2796_4_ + fVar137 * (float)bezier_basis0._3952_4_;
        auVar95._12_4_ =
             auVar152._12_4_ * (float)bezier_basis0._488_4_ +
             auVar88._12_4_ * (float)bezier_basis0._1644_4_ +
             fVar196 * (float)bezier_basis0._2800_4_ + fVar147 * (float)bezier_basis0._3956_4_;
        auVar95._16_4_ =
             fVar72 * (float)bezier_basis0._492_4_ +
             fVar201 * (float)bezier_basis0._1648_4_ +
             fVar181 * (float)bezier_basis0._2804_4_ + fVar117 * (float)bezier_basis0._3960_4_;
        auVar95._20_4_ =
             fVar32 * (float)bezier_basis0._496_4_ +
             fVar205 * (float)bezier_basis0._1652_4_ +
             fVar187 * (float)bezier_basis0._2808_4_ + fVar118 * (float)bezier_basis0._3964_4_;
        auVar95._24_4_ =
             fVar53 * (float)bezier_basis0._500_4_ +
             fVar213 * (float)bezier_basis0._1656_4_ +
             fVar192 * (float)bezier_basis0._2812_4_ + fVar137 * (float)bezier_basis0._3968_4_;
        auVar95._28_4_ = auVar199._28_4_ + (float)bezier_basis0._3972_4_ + 0.0 + 0.0;
        auVar33 = vshufps_avx(auVar23,auVar23,0xaa);
        fVar54 = auVar33._0_4_;
        fVar55 = auVar33._4_4_;
        fVar96 = auVar33._8_4_;
        fVar116 = auVar33._12_4_;
        auVar200._0_4_ =
             fVar54 * (float)bezier_basis0._476_4_ +
             fVar186 * (float)bezier_basis0._1632_4_ +
             fVar203 * (float)bezier_basis0._2788_4_ + fVar148 * (float)bezier_basis0._3944_4_;
        auVar200._4_4_ =
             fVar55 * (float)bezier_basis0._480_4_ +
             fVar136 * (float)bezier_basis0._1636_4_ +
             fVar211 * (float)bezier_basis0._2792_4_ + fVar149 * (float)bezier_basis0._3948_4_;
        auVar200._8_4_ =
             fVar96 * (float)bezier_basis0._484_4_ +
             fVar173 * (float)bezier_basis0._1640_4_ +
             fVar214 * (float)bezier_basis0._2796_4_ + fVar150 * (float)bezier_basis0._3952_4_;
        auVar200._12_4_ =
             fVar116 * (float)bezier_basis0._488_4_ +
             fVar178 * (float)bezier_basis0._1644_4_ +
             fVar151 * (float)bezier_basis0._2800_4_ + fVar160 * (float)bezier_basis0._3956_4_;
        auVar200._16_4_ =
             fVar54 * (float)bezier_basis0._492_4_ +
             fVar186 * (float)bezier_basis0._1648_4_ +
             fVar203 * (float)bezier_basis0._2804_4_ + fVar148 * (float)bezier_basis0._3960_4_;
        auVar200._20_4_ =
             fVar55 * (float)bezier_basis0._496_4_ +
             fVar136 * (float)bezier_basis0._1652_4_ +
             fVar211 * (float)bezier_basis0._2808_4_ + fVar149 * (float)bezier_basis0._3964_4_;
        auVar200._24_4_ =
             fVar96 * (float)bezier_basis0._500_4_ +
             fVar173 * (float)bezier_basis0._1656_4_ +
             fVar214 * (float)bezier_basis0._2812_4_ + fVar150 * (float)bezier_basis0._3968_4_;
        auVar200._28_4_ = auVar199._28_4_ + (float)bezier_basis0._2816_4_ + 0.0 + 0.0;
        auVar68._0_4_ =
             (float)bezier_basis0._5100_4_ * fVar57 +
             fVar184 * (float)bezier_basis0._6256_4_ +
             fVar161 * (float)bezier_basis0._7412_4_ + fVar162 * (float)bezier_basis0._8568_4_;
        auVar68._4_4_ =
             (float)bezier_basis0._5104_4_ * fVar56 +
             fVar190 * (float)bezier_basis0._6260_4_ +
             fVar163 * (float)bezier_basis0._7416_4_ + fVar164 * (float)bezier_basis0._8572_4_;
        auVar68._8_4_ =
             (float)bezier_basis0._5108_4_ * fVar70 +
             fVar194 * (float)bezier_basis0._6264_4_ +
             fVar174 * (float)bezier_basis0._7420_4_ + fVar180 * (float)bezier_basis0._8576_4_;
        auVar68._12_4_ =
             (float)bezier_basis0._5112_4_ * fVar71 +
             auVar12._12_4_ * (float)bezier_basis0._6268_4_ +
             fVar179 * (float)bezier_basis0._7424_4_ + fVar183 * (float)bezier_basis0._8580_4_;
        auVar68._16_4_ =
             (float)bezier_basis0._5116_4_ * fVar57 +
             fVar184 * (float)bezier_basis0._6272_4_ +
             fVar161 * (float)bezier_basis0._7428_4_ + fVar162 * (float)bezier_basis0._8584_4_;
        auVar68._20_4_ =
             (float)bezier_basis0._5120_4_ * fVar56 +
             fVar190 * (float)bezier_basis0._6276_4_ +
             fVar163 * (float)bezier_basis0._7432_4_ + fVar164 * (float)bezier_basis0._8588_4_;
        auVar68._24_4_ =
             (float)bezier_basis0._5124_4_ * fVar70 +
             fVar194 * (float)bezier_basis0._6280_4_ +
             fVar174 * (float)bezier_basis0._7436_4_ + fVar180 * (float)bezier_basis0._8592_4_;
        auVar68._28_4_ = fVar71 + fVar196 + fVar179 + fVar183;
        auVar51._0_4_ =
             (float)bezier_basis0._5100_4_ * fVar72 +
             fVar201 * (float)bezier_basis0._6256_4_ +
             fVar181 * (float)bezier_basis0._7412_4_ + fVar117 * (float)bezier_basis0._8568_4_;
        auVar51._4_4_ =
             (float)bezier_basis0._5104_4_ * fVar32 +
             fVar205 * (float)bezier_basis0._6260_4_ +
             fVar187 * (float)bezier_basis0._7416_4_ + fVar118 * (float)bezier_basis0._8572_4_;
        auVar51._8_4_ =
             (float)bezier_basis0._5108_4_ * fVar53 +
             fVar213 * (float)bezier_basis0._6264_4_ +
             fVar192 * (float)bezier_basis0._7420_4_ + fVar137 * (float)bezier_basis0._8576_4_;
        auVar51._12_4_ =
             (float)bezier_basis0._5112_4_ * auVar152._12_4_ +
             auVar88._12_4_ * (float)bezier_basis0._6268_4_ +
             fVar196 * (float)bezier_basis0._7424_4_ + fVar147 * (float)bezier_basis0._8580_4_;
        auVar51._16_4_ =
             (float)bezier_basis0._5116_4_ * fVar72 +
             fVar201 * (float)bezier_basis0._6272_4_ +
             fVar181 * (float)bezier_basis0._7428_4_ + fVar117 * (float)bezier_basis0._8584_4_;
        auVar51._20_4_ =
             (float)bezier_basis0._5120_4_ * fVar32 +
             fVar205 * (float)bezier_basis0._6276_4_ +
             fVar187 * (float)bezier_basis0._7432_4_ + fVar118 * (float)bezier_basis0._8588_4_;
        auVar51._24_4_ =
             (float)bezier_basis0._5124_4_ * fVar53 +
             fVar213 * (float)bezier_basis0._6280_4_ +
             fVar192 * (float)bezier_basis0._7436_4_ + fVar137 * (float)bezier_basis0._8592_4_;
        auVar51._28_4_ = (float)bezier_basis0._6284_4_ + fVar196 + fVar196 + fVar147;
        auVar114._0_4_ =
             (float)bezier_basis0._5100_4_ * fVar54 +
             fVar186 * (float)bezier_basis0._6256_4_ +
             (float)bezier_basis0._7412_4_ * fVar203 + fVar148 * (float)bezier_basis0._8568_4_;
        auVar114._4_4_ =
             (float)bezier_basis0._5104_4_ * fVar55 +
             fVar136 * (float)bezier_basis0._6260_4_ +
             (float)bezier_basis0._7416_4_ * fVar211 + fVar149 * (float)bezier_basis0._8572_4_;
        auVar114._8_4_ =
             (float)bezier_basis0._5108_4_ * fVar96 +
             fVar173 * (float)bezier_basis0._6264_4_ +
             (float)bezier_basis0._7420_4_ * fVar214 + fVar150 * (float)bezier_basis0._8576_4_;
        auVar114._12_4_ =
             (float)bezier_basis0._5112_4_ * fVar116 +
             fVar178 * (float)bezier_basis0._6268_4_ +
             (float)bezier_basis0._7424_4_ * fVar151 + fVar160 * (float)bezier_basis0._8580_4_;
        auVar114._16_4_ =
             (float)bezier_basis0._5116_4_ * fVar54 +
             fVar186 * (float)bezier_basis0._6272_4_ +
             (float)bezier_basis0._7428_4_ * fVar203 + fVar148 * (float)bezier_basis0._8584_4_;
        auVar114._20_4_ =
             (float)bezier_basis0._5120_4_ * fVar55 +
             fVar136 * (float)bezier_basis0._6276_4_ +
             (float)bezier_basis0._7432_4_ * fVar211 + fVar149 * (float)bezier_basis0._8588_4_;
        auVar114._24_4_ =
             (float)bezier_basis0._5124_4_ * fVar96 +
             fVar173 * (float)bezier_basis0._6280_4_ +
             (float)bezier_basis0._7436_4_ * fVar214 + fVar150 * (float)bezier_basis0._8592_4_;
        auVar114._28_4_ = fVar116 + fVar178 + fVar196 + fVar160;
        auVar172 = ZEXT1232(ZEXT412(0)) << 0x20;
        auVar11 = vblendps_avx(auVar68,auVar172,1);
        auVar172 = vblendps_avx(auVar51,auVar172,1);
        auVar170 = ZEXT1232(ZEXT412(0)) << 0x20;
        auVar177 = vblendps_avx(auVar114,auVar170,1);
        auVar19._4_4_ = auVar11._4_4_ * 0.055555556;
        auVar19._0_4_ = auVar11._0_4_ * 0.055555556;
        auVar19._8_4_ = auVar11._8_4_ * 0.055555556;
        auVar19._12_4_ = auVar11._12_4_ * 0.055555556;
        auVar19._16_4_ = auVar11._16_4_ * 0.055555556;
        auVar19._20_4_ = auVar11._20_4_ * 0.055555556;
        auVar19._24_4_ = auVar11._24_4_ * 0.055555556;
        auVar19._28_4_ = auVar11._28_4_;
        auVar20._4_4_ = auVar172._4_4_ * 0.055555556;
        auVar20._0_4_ = auVar172._0_4_ * 0.055555556;
        auVar20._8_4_ = auVar172._8_4_ * 0.055555556;
        auVar20._12_4_ = auVar172._12_4_ * 0.055555556;
        auVar20._16_4_ = auVar172._16_4_ * 0.055555556;
        auVar20._20_4_ = auVar172._20_4_ * 0.055555556;
        auVar20._24_4_ = auVar172._24_4_ * 0.055555556;
        auVar20._28_4_ = auVar172._28_4_;
        auVar21._4_4_ = auVar177._4_4_ * 0.055555556;
        auVar21._0_4_ = auVar177._0_4_ * 0.055555556;
        auVar21._8_4_ = auVar177._8_4_ * 0.055555556;
        auVar21._12_4_ = auVar177._12_4_ * 0.055555556;
        auVar21._16_4_ = auVar177._16_4_ * 0.055555556;
        auVar21._20_4_ = auVar177._20_4_ * 0.055555556;
        auVar21._24_4_ = auVar177._24_4_ * 0.055555556;
        auVar21._28_4_ = auVar177._28_4_;
        auVar93 = vsubps_avx(auVar217,auVar19);
        auVar16 = vsubps_avx(auVar95,auVar20);
        auVar47 = vsubps_avx(auVar200,auVar21);
        auVar11 = vblendps_avx(auVar68,auVar170,0x80);
        auVar172 = vblendps_avx(auVar51,auVar170,0x80);
        auVar177 = vblendps_avx(auVar114,auVar170,0x80);
        auVar69._0_4_ = auVar217._0_4_ + auVar11._0_4_ * 0.055555556;
        auVar69._4_4_ = auVar217._4_4_ + auVar11._4_4_ * 0.055555556;
        auVar69._8_4_ = auVar217._8_4_ + auVar11._8_4_ * 0.055555556;
        auVar69._12_4_ = auVar217._12_4_ + auVar11._12_4_ * 0.055555556;
        auVar69._16_4_ = auVar217._16_4_ + auVar11._16_4_ * 0.055555556;
        auVar69._20_4_ = auVar217._20_4_ + auVar11._20_4_ * 0.055555556;
        auVar69._24_4_ = auVar217._24_4_ + auVar11._24_4_ * 0.055555556;
        auVar69._28_4_ = auVar217._28_4_ + auVar11._28_4_;
        auVar52._0_4_ = auVar95._0_4_ + auVar172._0_4_ * 0.055555556;
        auVar52._4_4_ = auVar95._4_4_ + auVar172._4_4_ * 0.055555556;
        auVar52._8_4_ = auVar95._8_4_ + auVar172._8_4_ * 0.055555556;
        auVar52._12_4_ = auVar95._12_4_ + auVar172._12_4_ * 0.055555556;
        auVar52._16_4_ = auVar95._16_4_ + auVar172._16_4_ * 0.055555556;
        auVar52._20_4_ = auVar95._20_4_ + auVar172._20_4_ * 0.055555556;
        auVar52._24_4_ = auVar95._24_4_ + auVar172._24_4_ * 0.055555556;
        auVar52._28_4_ = auVar95._28_4_ + auVar172._28_4_;
        auVar115._0_4_ = auVar200._0_4_ + auVar177._0_4_ * 0.055555556;
        auVar115._4_4_ = auVar200._4_4_ + auVar177._4_4_ * 0.055555556;
        auVar115._8_4_ = auVar200._8_4_ + auVar177._8_4_ * 0.055555556;
        auVar115._12_4_ = auVar200._12_4_ + auVar177._12_4_ * 0.055555556;
        auVar115._16_4_ = auVar200._16_4_ + auVar177._16_4_ * 0.055555556;
        auVar115._20_4_ = auVar200._20_4_ + auVar177._20_4_ * 0.055555556;
        auVar115._24_4_ = auVar200._24_4_ + auVar177._24_4_ * 0.055555556;
        auVar115._28_4_ = auVar200._28_4_ + auVar177._28_4_;
        auVar87._8_4_ = 0x7f800000;
        auVar87._0_8_ = 0x7f8000007f800000;
        auVar87._12_4_ = 0x7f800000;
        auVar87._16_4_ = 0x7f800000;
        auVar87._20_4_ = 0x7f800000;
        auVar87._24_4_ = 0x7f800000;
        auVar87._28_4_ = 0x7f800000;
        auVar11 = vminps_avx(auVar87,auVar217);
        auVar172 = vminps_avx(auVar87,auVar95);
        auVar177 = vminps_avx(auVar87,auVar200);
        auVar170 = vminps_avx(auVar93,auVar69);
        auVar176 = vminps_avx(auVar11,auVar170);
        auVar11 = vminps_avx(auVar16,auVar52);
        auVar15 = vminps_avx(auVar172,auVar11);
        auVar11 = vminps_avx(auVar47,auVar115);
        auVar198 = vminps_avx(auVar177,auVar11);
        auVar11 = vmaxps_avx(auVar93,auVar69);
        auVar189._8_4_ = 0xff800000;
        auVar189._0_8_ = 0xff800000ff800000;
        auVar189._12_4_ = 0xff800000;
        auVar189._16_4_ = 0xff800000;
        auVar189._20_4_ = 0xff800000;
        auVar189._24_4_ = 0xff800000;
        auVar189._28_4_ = 0xff800000;
        auVar172 = vmaxps_avx(auVar189,auVar217);
        auVar11 = vmaxps_avx(auVar172,auVar11);
        auVar172 = vmaxps_avx(auVar16,auVar52);
        auVar177 = vmaxps_avx(auVar189,auVar95);
        auVar172 = vmaxps_avx(auVar177,auVar172);
        auVar177 = vmaxps_avx(auVar47,auVar115);
        auVar146 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
        auVar170 = vmaxps_avx(auVar189,auVar200);
        auVar177 = vmaxps_avx(auVar170,auVar177);
        auVar170 = vshufps_avx(auVar176,auVar176,0xb1);
        auVar170 = vminps_avx(auVar176,auVar170);
        auVar159 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
        auVar176 = vshufpd_avx(auVar170,auVar170,5);
        auVar170 = vminps_avx(auVar170,auVar176);
        auVar12 = vminps_avx(auVar170._0_16_,auVar170._16_16_);
        auVar170 = vshufps_avx(auVar15,auVar15,0xb1);
        auVar170 = vminps_avx(auVar15,auVar170);
        auVar176 = vshufpd_avx(auVar170,auVar170,5);
        auVar170 = vminps_avx(auVar170,auVar176);
        auVar88 = vminps_avx(auVar170._0_16_,auVar170._16_16_);
        auVar88 = vunpcklps_avx(auVar12,auVar88);
        auVar170 = vshufps_avx(auVar198,auVar198,0xb1);
        auVar170 = vminps_avx(auVar198,auVar170);
        auVar176 = vshufpd_avx(auVar170,auVar170,5);
        auVar170 = vminps_avx(auVar170,auVar176);
        auVar12 = vminps_avx(auVar170._0_16_,auVar170._16_16_);
        auVar12 = vinsertps_avx(auVar88,auVar12,0x28);
        auVar88 = vminps_avx(auVar63,auVar12);
        auVar170 = vshufps_avx(auVar11,auVar11,0xb1);
        auVar11 = vmaxps_avx(auVar11,auVar170);
        auVar170 = vshufpd_avx(auVar11,auVar11,5);
        auVar11 = vmaxps_avx(auVar11,auVar170);
        auVar63 = vmaxps_avx(auVar11._0_16_,auVar11._16_16_);
        auVar11 = vshufps_avx(auVar172,auVar172,0xb1);
        auVar11 = vmaxps_avx(auVar172,auVar11);
        auVar172 = vshufpd_avx(auVar11,auVar11,5);
        auVar11 = vmaxps_avx(auVar11,auVar172);
        auVar12 = vmaxps_avx(auVar11._0_16_,auVar11._16_16_);
        auVar12 = vunpcklps_avx(auVar63,auVar12);
        auVar11 = vshufps_avx(auVar177,auVar177,0xb1);
        auVar11 = vmaxps_avx(auVar177,auVar11);
        auVar172 = vshufpd_avx(auVar11,auVar11,5);
        auVar11 = vmaxps_avx(auVar11,auVar172);
        auVar63 = vmaxps_avx(auVar11._0_16_,auVar11._16_16_);
        auVar63 = vinsertps_avx(auVar12,auVar63,0x28);
        auVar12 = vmaxps_avx(auVar58,auVar63);
        auVar91._8_4_ = 0x7fffffff;
        auVar91._0_8_ = 0x7fffffff7fffffff;
        auVar91._12_4_ = 0x7fffffff;
        auVar63 = vandps_avx(auVar88,auVar91);
        auVar58 = vandps_avx(auVar12,auVar91);
        auVar63 = vmaxps_avx(auVar63,auVar58);
        auVar58 = vmovshdup_avx(auVar63);
        auVar58 = vmaxss_avx(auVar58,auVar63);
        auVar63 = vshufpd_avx(auVar63,auVar63,1);
        auVar63 = vmaxss_avx(auVar63,auVar58);
        auVar63 = ZEXT416((uint)(auVar63._0_4_ * 4.7683716e-07));
        auVar63 = vshufps_avx(auVar63,auVar63,0);
        auVar58 = vsubps_avx(auVar88,auVar63);
        aVar13 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar58,ZEXT416(geomID),0x30);
        auVar46._0_4_ = auVar12._0_4_ + auVar63._0_4_;
        auVar46._4_4_ = auVar12._4_4_ + auVar63._4_4_;
        auVar46._8_4_ = auVar12._8_4_ + auVar63._8_4_;
        auVar46._12_4_ = auVar12._12_4_ + auVar63._12_4_;
        aVar14 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar46,ZEXT416((uint)uVar28),0x30);
        auVar64._0_4_ = aVar13.x + aVar14.x;
        auVar64._4_4_ = aVar13.y + aVar14.y;
        auVar64._8_4_ = aVar13.z + aVar14.z;
        auVar64._12_4_ = aVar13.field_3.w + aVar14.field_3.w;
        local_208 = vminps_avx(local_208,auVar64);
        local_218 = vmaxps_avx(local_218,auVar64);
        local_1e8 = vmaxps_avx(local_1e8,(undefined1  [16])aVar14);
        prims[local_220].upper.field_0.field_1 = aVar14;
        local_1f8 = vminps_avx(local_1f8,(undefined1  [16])aVar13);
        prims[local_220].lower.field_0.field_1 = aVar13;
        local_240 = local_240 + 1;
        local_220 = local_220 + 1;
      }
LAB_01207589:
      uVar28 = uVar28 + 1;
    } while (uVar28 < r->_end);
  }
  else {
    local_240 = 0;
    local_218._8_4_ = 0xff800000;
    local_218._0_8_ = 0xff800000ff800000;
    local_218._12_4_ = 0xff800000;
    local_1e8._8_4_ = 0xff800000;
    local_1e8._0_8_ = 0xff800000ff800000;
    local_1e8._12_4_ = 0xff800000;
    local_208._8_4_ = 0x7f800000;
    local_208._0_8_ = 0x7f8000007f800000;
    local_208._12_4_ = 0x7f800000;
    local_1f8._8_4_ = 0x7f800000;
    local_1f8._0_8_ = 0x7f8000007f800000;
    local_1f8._12_4_ = 0x7f800000;
  }
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
       = local_1f8._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
           field_0 + 8) = local_1f8._8_8_;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
       = local_1e8._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
           field_0 + 8) = local_1e8._8_8_;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = local_208._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
           field_0 + 8) = local_208._8_8_;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = local_218._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
           field_0 + 8) = local_218._8_8_;
  __return_storage_ptr__->end = local_240;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, make_range<size_t>(0, numTimeSegments()))) continue;
          const BBox3fa box = bounds(j);
          const PrimRef prim(box,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }